

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  ulong uVar49;
  long lVar50;
  uint uVar51;
  byte bVar52;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ulong uVar53;
  bool bVar54;
  byte bVar55;
  uint uVar56;
  undefined1 uVar57;
  bool bVar58;
  undefined1 uVar59;
  ulong uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  float pp;
  undefined1 auVar217 [32];
  float fVar141;
  undefined4 uVar142;
  undefined1 auVar143 [16];
  undefined1 auVar150 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar156;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar164 [32];
  undefined1 auVar157 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar239;
  undefined1 auVar238 [32];
  undefined1 auVar240 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cd0;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar2 = prim[1];
  uVar49 = (ulong)(byte)PVar2;
  fVar201 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar69 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar72 = vsubps_avx(auVar65,*(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  fVar200 = fVar201 * auVar72._0_4_;
  fVar141 = fVar201 * auVar69._0_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar49 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar65);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar49 * 5 + 6);
  auVar79 = vpmovsxbd_avx2(auVar12);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar49 * 6 + 6);
  auVar82 = vpmovsxbd_avx2(auVar66);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar49 * 0xb + 6);
  auVar83 = vpmovsxbd_avx2(auVar1);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar88 = vpmovsxbd_avx2(auVar63);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar88);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar49 + 6);
  auVar80 = vpmovsxbd_avx2(auVar71);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar60 = (ulong)(uint)((int)(uVar49 * 9) * 2);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar85 = vpmovsxbd_avx2(auVar67);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar60 + uVar49 + 6);
  auVar86 = vpmovsxbd_avx2(auVar64);
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar53 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar53 + 6);
  auVar78 = vpmovsxbd_avx2(auVar68);
  auVar87 = vcvtdq2ps_avx(auVar78);
  auVar98._4_4_ = fVar141;
  auVar98._0_4_ = fVar141;
  auVar98._8_4_ = fVar141;
  auVar98._12_4_ = fVar141;
  auVar98._16_4_ = fVar141;
  auVar98._20_4_ = fVar141;
  auVar98._24_4_ = fVar141;
  auVar98._28_4_ = fVar141;
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar90 = ZEXT1632(CONCAT412(fVar201 * auVar69._12_4_,
                               CONCAT48(fVar201 * auVar69._8_4_,
                                        CONCAT44(fVar201 * auVar69._4_4_,fVar141))));
  auVar89 = vpermps_avx2(auVar100,auVar90);
  auVar77 = vpermps_avx512vl(auVar76,auVar90);
  fVar141 = auVar77._0_4_;
  fVar156 = auVar77._4_4_;
  auVar90._4_4_ = fVar156 * auVar82._4_4_;
  auVar90._0_4_ = fVar141 * auVar82._0_4_;
  fVar168 = auVar77._8_4_;
  auVar90._8_4_ = fVar168 * auVar82._8_4_;
  fVar169 = auVar77._12_4_;
  auVar90._12_4_ = fVar169 * auVar82._12_4_;
  fVar170 = auVar77._16_4_;
  auVar90._16_4_ = fVar170 * auVar82._16_4_;
  fVar172 = auVar77._20_4_;
  auVar90._20_4_ = fVar172 * auVar82._20_4_;
  fVar171 = auVar77._24_4_;
  auVar90._24_4_ = fVar171 * auVar82._24_4_;
  auVar90._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar80._4_4_ * fVar156;
  auVar88._0_4_ = auVar80._0_4_ * fVar141;
  auVar88._8_4_ = auVar80._8_4_ * fVar168;
  auVar88._12_4_ = auVar80._12_4_ * fVar169;
  auVar88._16_4_ = auVar80._16_4_ * fVar170;
  auVar88._20_4_ = auVar80._20_4_ * fVar172;
  auVar88._24_4_ = auVar80._24_4_ * fVar171;
  auVar88._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar87._4_4_ * fVar156;
  auVar78._0_4_ = auVar87._0_4_ * fVar141;
  auVar78._8_4_ = auVar87._8_4_ * fVar168;
  auVar78._12_4_ = auVar87._12_4_ * fVar169;
  auVar78._16_4_ = auVar87._16_4_ * fVar170;
  auVar78._20_4_ = auVar87._20_4_ * fVar172;
  auVar78._24_4_ = auVar87._24_4_ * fVar171;
  auVar78._28_4_ = auVar77._28_4_;
  auVar65 = vfmadd231ps_fma(auVar90,auVar89,auVar79);
  auVar12 = vfmadd231ps_fma(auVar88,auVar89,auVar84);
  auVar66 = vfmadd231ps_fma(auVar78,auVar86,auVar89);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar98,auVar81);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar98,auVar83);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar85,auVar98);
  auVar99._4_4_ = fVar200;
  auVar99._0_4_ = fVar200;
  auVar99._8_4_ = fVar200;
  auVar99._12_4_ = fVar200;
  auVar99._16_4_ = fVar200;
  auVar99._20_4_ = fVar200;
  auVar99._24_4_ = fVar200;
  auVar99._28_4_ = fVar200;
  auVar78 = ZEXT1632(CONCAT412(fVar201 * auVar72._12_4_,
                               CONCAT48(fVar201 * auVar72._8_4_,
                                        CONCAT44(fVar201 * auVar72._4_4_,fVar200))));
  auVar88 = vpermps_avx2(auVar100,auVar78);
  auVar78 = vpermps_avx512vl(auVar76,auVar78);
  fVar201 = auVar78._0_4_;
  fVar141 = auVar78._4_4_;
  auVar89._4_4_ = fVar141 * auVar82._4_4_;
  auVar89._0_4_ = fVar201 * auVar82._0_4_;
  fVar156 = auVar78._8_4_;
  auVar89._8_4_ = fVar156 * auVar82._8_4_;
  fVar168 = auVar78._12_4_;
  auVar89._12_4_ = fVar168 * auVar82._12_4_;
  fVar169 = auVar78._16_4_;
  auVar89._16_4_ = fVar169 * auVar82._16_4_;
  fVar170 = auVar78._20_4_;
  auVar89._20_4_ = fVar170 * auVar82._20_4_;
  fVar172 = auVar78._24_4_;
  auVar89._24_4_ = fVar172 * auVar82._24_4_;
  auVar89._28_4_ = 1;
  auVar76._4_4_ = auVar80._4_4_ * fVar141;
  auVar76._0_4_ = auVar80._0_4_ * fVar201;
  auVar76._8_4_ = auVar80._8_4_ * fVar156;
  auVar76._12_4_ = auVar80._12_4_ * fVar168;
  auVar76._16_4_ = auVar80._16_4_ * fVar169;
  auVar76._20_4_ = auVar80._20_4_ * fVar170;
  auVar76._24_4_ = auVar80._24_4_ * fVar172;
  auVar76._28_4_ = auVar82._28_4_;
  auVar80._4_4_ = auVar87._4_4_ * fVar141;
  auVar80._0_4_ = auVar87._0_4_ * fVar201;
  auVar80._8_4_ = auVar87._8_4_ * fVar156;
  auVar80._12_4_ = auVar87._12_4_ * fVar168;
  auVar80._16_4_ = auVar87._16_4_ * fVar169;
  auVar80._20_4_ = auVar87._20_4_ * fVar170;
  auVar80._24_4_ = auVar87._24_4_ * fVar172;
  auVar80._28_4_ = auVar78._28_4_;
  auVar1 = vfmadd231ps_fma(auVar89,auVar88,auVar79);
  auVar63 = vfmadd231ps_fma(auVar76,auVar88,auVar84);
  auVar71 = vfmadd231ps_fma(auVar80,auVar88,auVar86);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar99,auVar81);
  auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar99,auVar83);
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar99,auVar85);
  auVar81 = vandps_avx(ZEXT1632(auVar65),auVar95);
  auVar97._8_4_ = 0x219392ef;
  auVar97._0_8_ = 0x219392ef219392ef;
  auVar97._12_4_ = 0x219392ef;
  auVar97._16_4_ = 0x219392ef;
  auVar97._20_4_ = 0x219392ef;
  auVar97._24_4_ = 0x219392ef;
  auVar97._28_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar81,auVar97,1);
  bVar54 = (bool)((byte)uVar60 & 1);
  auVar77._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._0_4_;
  bVar54 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._4_4_;
  bVar54 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._8_4_;
  bVar54 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar12),auVar95);
  uVar60 = vcmpps_avx512vl(auVar81,auVar97,1);
  bVar54 = (bool)((byte)uVar60 & 1);
  auVar91._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar12._0_4_;
  bVar54 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar12._4_4_;
  bVar54 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar12._8_4_;
  bVar54 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar12._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar66),auVar95);
  uVar60 = vcmpps_avx512vl(auVar81,auVar97,1);
  bVar54 = (bool)((byte)uVar60 & 1);
  auVar81._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._0_4_;
  bVar54 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._4_4_;
  bVar54 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._8_4_;
  bVar54 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar96._16_4_ = 0x3f800000;
  auVar96._20_4_ = 0x3f800000;
  auVar96._24_4_ = 0x3f800000;
  auVar96._28_4_ = 0x3f800000;
  auVar65 = vfnmadd213ps_fma(auVar77,auVar79,auVar96);
  auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar91);
  auVar12 = vfnmadd213ps_fma(auVar91,auVar79,auVar96);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar81);
  auVar66 = vfnmadd213ps_fma(auVar81,auVar79,auVar96);
  auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar79,auVar79);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar49 * 7 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar1));
  auVar85._4_4_ = auVar65._4_4_ * auVar81._4_4_;
  auVar85._0_4_ = auVar65._0_4_ * auVar81._0_4_;
  auVar85._8_4_ = auVar65._8_4_ * auVar81._8_4_;
  auVar85._12_4_ = auVar65._12_4_ * auVar81._12_4_;
  auVar85._16_4_ = auVar81._16_4_ * 0.0;
  auVar85._20_4_ = auVar81._20_4_ * 0.0;
  auVar85._24_4_ = auVar81._24_4_ * 0.0;
  auVar85._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar49 * 9 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar1));
  auVar80 = vpbroadcastd_avx512vl();
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar94._0_4_ = auVar65._0_4_ * auVar81._0_4_;
  auVar94._4_4_ = auVar65._4_4_ * auVar81._4_4_;
  auVar94._8_4_ = auVar65._8_4_ * auVar81._8_4_;
  auVar94._12_4_ = auVar65._12_4_ * auVar81._12_4_;
  auVar94._16_4_ = auVar81._16_4_ * 0.0;
  auVar94._20_4_ = auVar81._20_4_ * 0.0;
  auVar94._24_4_ = auVar81._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar49 * -2 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar63));
  auVar86._4_4_ = auVar12._4_4_ * auVar81._4_4_;
  auVar86._0_4_ = auVar12._0_4_ * auVar81._0_4_;
  auVar86._8_4_ = auVar12._8_4_ * auVar81._8_4_;
  auVar86._12_4_ = auVar12._12_4_ * auVar81._12_4_;
  auVar86._16_4_ = auVar81._16_4_ * 0.0;
  auVar86._20_4_ = auVar81._20_4_ * 0.0;
  auVar86._24_4_ = auVar81._24_4_ * 0.0;
  auVar86._28_4_ = auVar81._28_4_;
  auVar81 = vcvtdq2ps_avx(auVar79);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar63));
  auVar93._0_4_ = auVar12._0_4_ * auVar81._0_4_;
  auVar93._4_4_ = auVar12._4_4_ * auVar81._4_4_;
  auVar93._8_4_ = auVar12._8_4_ * auVar81._8_4_;
  auVar93._12_4_ = auVar12._12_4_ * auVar81._12_4_;
  auVar93._16_4_ = auVar81._16_4_ * 0.0;
  auVar93._20_4_ = auVar81._20_4_ * 0.0;
  auVar93._24_4_ = auVar81._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 + uVar49 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar71));
  auVar87._4_4_ = auVar81._4_4_ * auVar66._4_4_;
  auVar87._0_4_ = auVar81._0_4_ * auVar66._0_4_;
  auVar87._8_4_ = auVar81._8_4_ * auVar66._8_4_;
  auVar87._12_4_ = auVar81._12_4_ * auVar66._12_4_;
  auVar87._16_4_ = auVar81._16_4_ * 0.0;
  auVar87._20_4_ = auVar81._20_4_ * 0.0;
  auVar87._24_4_ = auVar81._24_4_ * 0.0;
  auVar87._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar49 * 0x17 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar71));
  auVar92._0_4_ = auVar66._0_4_ * auVar81._0_4_;
  auVar92._4_4_ = auVar66._4_4_ * auVar81._4_4_;
  auVar92._8_4_ = auVar66._8_4_ * auVar81._8_4_;
  auVar92._12_4_ = auVar66._12_4_ * auVar81._12_4_;
  auVar92._16_4_ = auVar81._16_4_ * 0.0;
  auVar92._20_4_ = auVar81._20_4_ * 0.0;
  auVar92._24_4_ = auVar81._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar85,auVar94);
  auVar79 = vpminsd_avx2(auVar86,auVar93);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79 = vpminsd_avx2(auVar87,auVar92);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar82._4_4_ = uVar142;
  auVar82._0_4_ = uVar142;
  auVar82._8_4_ = uVar142;
  auVar82._12_4_ = uVar142;
  auVar82._16_4_ = uVar142;
  auVar82._20_4_ = uVar142;
  auVar82._24_4_ = uVar142;
  auVar82._28_4_ = uVar142;
  auVar79 = vmaxps_avx512vl(auVar79,auVar82);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79._8_4_ = 0x3f7ffffa;
  auVar79._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar79._12_4_ = 0x3f7ffffa;
  auVar79._16_4_ = 0x3f7ffffa;
  auVar79._20_4_ = 0x3f7ffffa;
  auVar79._24_4_ = 0x3f7ffffa;
  auVar79._28_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar81,auVar79);
  auVar81 = vpmaxsd_avx2(auVar85,auVar94);
  auVar79 = vpmaxsd_avx2(auVar86,auVar93);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar79 = vpmaxsd_avx2(auVar87,auVar92);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar83._4_4_ = uVar142;
  auVar83._0_4_ = uVar142;
  auVar83._8_4_ = uVar142;
  auVar83._12_4_ = uVar142;
  auVar83._16_4_ = uVar142;
  auVar83._20_4_ = uVar142;
  auVar83._24_4_ = uVar142;
  auVar83._28_4_ = uVar142;
  auVar79 = vminps_avx512vl(auVar79,auVar83);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar84._8_4_ = 0x3f800003;
  auVar84._0_8_ = 0x3f8000033f800003;
  auVar84._12_4_ = 0x3f800003;
  auVar84._16_4_ = 0x3f800003;
  auVar84._20_4_ = 0x3f800003;
  auVar84._24_4_ = 0x3f800003;
  auVar84._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar84);
  uVar15 = vpcmpgtd_avx512vl(auVar80,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_5e0,auVar81,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return false;
  }
  local_8e8 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  auVar155 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar155);
  local_8f0 = prim;
LAB_01d53231:
  lVar50 = 0;
  for (uVar60 = local_8e8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar56 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar56].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar50 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar50 = *(long *)&pGVar3[1].time_range.upper;
  auVar65 = *(undefined1 (*) [16])(lVar50 + (long)p_Var4 * uVar60);
  auVar12 = *(undefined1 (*) [16])(lVar50 + (uVar60 + 1) * (long)p_Var4);
  auVar66 = *(undefined1 (*) [16])(lVar50 + (uVar60 + 2) * (long)p_Var4);
  local_8e8 = local_8e8 - 1 & local_8e8;
  auVar1 = *(undefined1 (*) [16])(lVar50 + (uVar60 + 3) * (long)p_Var4);
  if (local_8e8 != 0) {
    uVar53 = local_8e8 - 1 & local_8e8;
    for (uVar60 = local_8e8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    }
    if (uVar53 != 0) {
      for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar71 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar63 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar68 = auVar82._0_16_;
  local_990 = vinsertps_avx512f(auVar63,auVar68,0x28);
  auVar72._0_4_ = auVar65._0_4_ + auVar12._0_4_ + auVar66._0_4_ + auVar1._0_4_;
  auVar72._4_4_ = auVar65._4_4_ + auVar12._4_4_ + auVar66._4_4_ + auVar1._4_4_;
  auVar72._8_4_ = auVar65._8_4_ + auVar12._8_4_ + auVar66._8_4_ + auVar1._8_4_;
  auVar72._12_4_ = auVar65._12_4_ + auVar12._12_4_ + auVar66._12_4_ + auVar1._12_4_;
  auVar69._8_4_ = 0x3e800000;
  auVar69._0_8_ = 0x3e8000003e800000;
  auVar69._12_4_ = 0x3e800000;
  auVar63 = vmulps_avx512vl(auVar72,auVar69);
  auVar63 = vsubps_avx(auVar63,auVar71);
  auVar63 = vdpps_avx(auVar63,local_990,0x7f);
  fVar201 = *(float *)(ray + k * 4 + 0xc0);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar73._4_12_ = ZEXT812(0) << 0x20;
  auVar73._0_4_ = local_9a0._0_4_;
  auVar64 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar73);
  auVar67 = vfnmadd213ss_fma(auVar64,local_9a0,ZEXT416(0x40000000));
  fVar141 = auVar63._0_4_ * auVar64._0_4_ * auVar67._0_4_;
  auVar70._4_4_ = fVar141;
  auVar70._0_4_ = fVar141;
  auVar70._8_4_ = fVar141;
  auVar70._12_4_ = fVar141;
  auVar63 = vfmadd231ps_fma(auVar71,local_990,auVar70);
  auVar63 = vblendps_avx(auVar63,ZEXT816(0) << 0x40,8);
  auVar65 = vsubps_avx(auVar65,auVar63);
  auVar66 = vsubps_avx(auVar66,auVar63);
  auVar12 = vsubps_avx(auVar12,auVar63);
  auVar1 = vsubps_avx(auVar1,auVar63);
  uVar142 = auVar65._0_4_;
  auVar237._4_4_ = uVar142;
  auVar237._0_4_ = uVar142;
  auVar237._8_4_ = uVar142;
  auVar237._12_4_ = uVar142;
  auVar237._16_4_ = uVar142;
  auVar237._20_4_ = uVar142;
  auVar237._24_4_ = uVar142;
  auVar237._28_4_ = uVar142;
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  local_860 = ZEXT1632(auVar65);
  auVar83 = vpermps_avx512vl(auVar102,local_860);
  auVar103._8_4_ = 2;
  auVar103._0_8_ = 0x200000002;
  auVar103._12_4_ = 2;
  auVar103._16_4_ = 2;
  auVar103._20_4_ = 2;
  auVar103._24_4_ = 2;
  auVar103._28_4_ = 2;
  auVar81 = vpermps_avx2(auVar103,local_860);
  auVar104._8_4_ = 3;
  auVar104._0_8_ = 0x300000003;
  auVar104._12_4_ = 3;
  auVar104._16_4_ = 3;
  auVar104._20_4_ = 3;
  auVar104._24_4_ = 3;
  auVar104._28_4_ = 3;
  auVar79 = vpermps_avx2(auVar104,local_860);
  uVar142 = auVar12._0_4_;
  local_5a0._4_4_ = uVar142;
  local_5a0._0_4_ = uVar142;
  local_5a0._8_4_ = uVar142;
  local_5a0._12_4_ = uVar142;
  local_5a0._16_4_ = uVar142;
  local_5a0._20_4_ = uVar142;
  local_5a0._24_4_ = uVar142;
  local_5a0._28_4_ = uVar142;
  local_8a0 = ZEXT1632(auVar12);
  local_8e0 = vpermps_avx2(auVar102,local_8a0);
  auVar219 = ZEXT3264(local_8e0);
  auVar84 = vpermps_avx512vl(auVar103,local_8a0);
  auVar80 = vpermps_avx512vl(auVar104,local_8a0);
  auVar85 = vbroadcastss_avx512vl(auVar66);
  local_880 = ZEXT1632(auVar66);
  auVar86 = vpermps_avx512vl(auVar102,local_880);
  auVar87 = vpermps_avx512vl(auVar103,local_880);
  auVar88 = vpermps_avx512vl(auVar104,local_880);
  auVar78 = vbroadcastss_avx512vl(auVar1);
  _local_8c0 = ZEXT1632(auVar1);
  auVar89 = vpermps_avx512vl(auVar102,_local_8c0);
  auVar90 = vpermps_avx512vl(auVar103,_local_8c0);
  auVar76 = vpermps_avx512vl(auVar104,_local_8c0);
  auVar65 = vmulss_avx512f(auVar68,auVar68);
  auVar77 = vfmadd231ps_avx512vl(ZEXT1632(auVar65),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar77,local_760,local_760);
  uVar142 = local_580._0_4_;
  local_560._4_4_ = uVar142;
  local_560._0_4_ = uVar142;
  local_560._8_4_ = uVar142;
  local_560._12_4_ = uVar142;
  local_560._16_4_ = uVar142;
  local_560._20_4_ = uVar142;
  local_560._24_4_ = uVar142;
  local_560._28_4_ = uVar142;
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar101);
  local_950 = ZEXT416((uint)fVar141);
  local_5c0 = fVar201 - fVar141;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  auVar155 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar155);
  local_cd0 = 1;
  uVar51 = 0;
  bVar54 = false;
  auVar155 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar155);
  auVar65 = vsqrtss_avx(local_9a0,local_9a0);
  auVar12 = vsqrtss_avx(local_9a0,local_9a0);
  local_960 = ZEXT816(0x3f80000000000000);
  auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar66 = vmovshdup_avx(local_960);
    auVar66 = vsubps_avx(auVar66,local_960);
    fVar156 = auVar66._0_4_;
    fVar172 = fVar156 * 0.04761905;
    auVar212._0_4_ = local_960._0_4_;
    auVar212._4_4_ = auVar212._0_4_;
    auVar212._8_4_ = auVar212._0_4_;
    auVar212._12_4_ = auVar212._0_4_;
    auVar212._16_4_ = auVar212._0_4_;
    auVar212._20_4_ = auVar212._0_4_;
    auVar212._24_4_ = auVar212._0_4_;
    auVar212._28_4_ = auVar212._0_4_;
    auVar233._4_4_ = fVar156;
    auVar233._0_4_ = fVar156;
    auVar233._8_4_ = fVar156;
    auVar233._12_4_ = fVar156;
    auVar233._16_4_ = fVar156;
    auVar233._20_4_ = fVar156;
    auVar233._24_4_ = fVar156;
    auVar233._28_4_ = fVar156;
    auVar66 = vfmadd231ps_fma(auVar212,auVar233,_DAT_01faff20);
    auVar224 = auVar155._0_32_;
    auVar77 = vsubps_avx(auVar224,ZEXT1632(auVar66));
    fVar156 = auVar66._0_4_;
    fVar168 = auVar66._4_4_;
    auVar120._4_4_ = local_5a0._4_4_ * fVar168;
    auVar120._0_4_ = local_5a0._0_4_ * fVar156;
    fVar169 = auVar66._8_4_;
    auVar120._8_4_ = local_5a0._8_4_ * fVar169;
    fVar170 = auVar66._12_4_;
    auVar120._12_4_ = local_5a0._12_4_ * fVar170;
    auVar120._16_4_ = local_5a0._16_4_ * 0.0;
    auVar120._20_4_ = local_5a0._20_4_ * 0.0;
    auVar120._24_4_ = local_5a0._24_4_ * 0.0;
    auVar120._28_4_ = DAT_01faff20._28_4_;
    auVar94 = ZEXT1632(auVar66);
    auVar110._4_4_ = auVar219._4_4_ * fVar168;
    auVar110._0_4_ = auVar219._0_4_ * fVar156;
    auVar110._8_4_ = auVar219._8_4_ * fVar169;
    auVar110._12_4_ = auVar219._12_4_ * fVar170;
    auVar110._16_4_ = auVar219._16_4_ * 0.0;
    auVar110._20_4_ = auVar219._20_4_ * 0.0;
    auVar110._24_4_ = auVar219._24_4_ * 0.0;
    auVar110._28_4_ = auVar212._0_4_;
    auVar91 = vmulps_avx512vl(auVar84,auVar94);
    auVar92 = vmulps_avx512vl(auVar80,auVar94);
    auVar1 = vfmadd231ps_fma(auVar120,auVar77,auVar237);
    auVar93 = vfmadd231ps_avx512vl(auVar110,auVar77,auVar83);
    auVar63 = vfmadd231ps_fma(auVar91,auVar77,auVar81);
    auVar71 = vfmadd231ps_fma(auVar92,auVar77,auVar79);
    auVar91 = vmulps_avx512vl(auVar85,auVar94);
    auVar98 = ZEXT1632(auVar66);
    auVar92 = vmulps_avx512vl(auVar86,auVar98);
    auVar94 = vmulps_avx512vl(auVar87,auVar98);
    auVar95 = vmulps_avx512vl(auVar88,auVar98);
    auVar67 = vfmadd231ps_fma(auVar91,auVar77,local_5a0);
    auVar64 = vfmadd231ps_fma(auVar92,auVar77,auVar219._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar94,auVar77,auVar84);
    auVar92 = vfmadd231ps_avx512vl(auVar95,auVar77,auVar80);
    auVar94 = vmulps_avx512vl(auVar78,auVar98);
    auVar95 = vmulps_avx512vl(auVar89,auVar98);
    auVar96 = vmulps_avx512vl(auVar90,auVar98);
    auVar97 = vmulps_avx512vl(auVar76,auVar98);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar77,auVar85);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar77,auVar86);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar77,auVar87);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar77,auVar88);
    auVar111._28_4_ = auVar219._28_4_;
    auVar111._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar67._12_4_,
                            CONCAT48(fVar169 * auVar67._8_4_,
                                     CONCAT44(fVar168 * auVar67._4_4_,fVar156 * auVar67._0_4_))));
    auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar64));
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar66),auVar91);
    auVar100 = vmulps_avx512vl(ZEXT1632(auVar66),auVar92);
    auVar66 = vfmadd231ps_fma(auVar111,auVar77,ZEXT1632(auVar1));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar77,auVar93);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar77,ZEXT1632(auVar63));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar77,ZEXT1632(auVar71));
    auVar229._0_4_ = auVar94._0_4_ * fVar156;
    auVar229._4_4_ = auVar94._4_4_ * fVar168;
    auVar229._8_4_ = auVar94._8_4_ * fVar169;
    auVar229._12_4_ = auVar94._12_4_ * fVar170;
    auVar229._16_4_ = auVar94._16_4_ * 0.0;
    auVar229._20_4_ = auVar94._20_4_ * 0.0;
    auVar229._24_4_ = auVar94._24_4_ * 0.0;
    auVar229._28_4_ = 0;
    auVar112._4_4_ = auVar95._4_4_ * fVar168;
    auVar112._0_4_ = auVar95._0_4_ * fVar156;
    auVar112._8_4_ = auVar95._8_4_ * fVar169;
    auVar112._12_4_ = auVar95._12_4_ * fVar170;
    auVar112._16_4_ = auVar95._16_4_ * 0.0;
    auVar112._20_4_ = auVar95._20_4_ * 0.0;
    auVar112._24_4_ = auVar95._24_4_ * 0.0;
    auVar112._28_4_ = auVar94._28_4_;
    auVar113._4_4_ = auVar96._4_4_ * fVar168;
    auVar113._0_4_ = auVar96._0_4_ * fVar156;
    auVar113._8_4_ = auVar96._8_4_ * fVar169;
    auVar113._12_4_ = auVar96._12_4_ * fVar170;
    auVar113._16_4_ = auVar96._16_4_ * 0.0;
    auVar113._20_4_ = auVar96._20_4_ * 0.0;
    auVar113._24_4_ = auVar96._24_4_ * 0.0;
    auVar113._28_4_ = auVar95._28_4_;
    auVar217._4_4_ = auVar97._4_4_ * fVar168;
    auVar217._0_4_ = auVar97._0_4_ * fVar156;
    auVar217._8_4_ = auVar97._8_4_ * fVar169;
    auVar217._12_4_ = auVar97._12_4_ * fVar170;
    auVar217._16_4_ = auVar97._16_4_ * 0.0;
    auVar217._20_4_ = auVar97._20_4_ * 0.0;
    auVar217._24_4_ = auVar97._24_4_ * 0.0;
    auVar217._28_4_ = auVar96._28_4_;
    auVar1 = vfmadd231ps_fma(auVar229,auVar77,ZEXT1632(auVar67));
    auVar63 = vfmadd231ps_fma(auVar112,auVar77,ZEXT1632(auVar64));
    auVar71 = vfmadd231ps_fma(auVar113,auVar77,auVar91);
    auVar67 = vfmadd231ps_fma(auVar217,auVar77,auVar92);
    auVar114._28_4_ = auVar93._28_4_;
    auVar114._0_28_ =
         ZEXT1628(CONCAT412(auVar63._12_4_ * fVar170,
                            CONCAT48(auVar63._8_4_ * fVar169,
                                     CONCAT44(auVar63._4_4_ * fVar168,auVar63._0_4_ * fVar156))));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar1._12_4_,
                                                 CONCAT48(fVar169 * auVar1._8_4_,
                                                          CONCAT44(fVar168 * auVar1._4_4_,
                                                                   fVar156 * auVar1._0_4_)))),
                              auVar77,ZEXT1632(auVar66));
    auVar95 = vfmadd231ps_avx512vl(auVar114,auVar77,auVar98);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar71._12_4_ * fVar170,
                                            CONCAT48(auVar71._8_4_ * fVar169,
                                                     CONCAT44(auVar71._4_4_ * fVar168,
                                                              auVar71._0_4_ * fVar156)))),auVar77,
                         auVar99);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar67._12_4_ * fVar170,
                                            CONCAT48(auVar67._8_4_ * fVar169,
                                                     CONCAT44(auVar67._4_4_ * fVar168,
                                                              auVar67._0_4_ * fVar156)))),auVar100,
                         auVar77);
    auVar77 = vsubps_avx(ZEXT1632(auVar1),ZEXT1632(auVar66));
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar63),auVar98);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar71),auVar99);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar67),auVar100);
    auVar238._0_4_ = fVar172 * auVar77._0_4_ * 3.0;
    auVar238._4_4_ = fVar172 * auVar77._4_4_ * 3.0;
    auVar238._8_4_ = fVar172 * auVar77._8_4_ * 3.0;
    auVar238._12_4_ = fVar172 * auVar77._12_4_ * 3.0;
    auVar238._16_4_ = fVar172 * auVar77._16_4_ * 3.0;
    auVar238._20_4_ = fVar172 * auVar77._20_4_ * 3.0;
    auVar238._24_4_ = fVar172 * auVar77._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    auVar240._0_4_ = fVar172 * auVar92._0_4_ * 3.0;
    auVar240._4_4_ = fVar172 * auVar92._4_4_ * 3.0;
    auVar240._8_4_ = fVar172 * auVar92._8_4_ * 3.0;
    auVar240._12_4_ = fVar172 * auVar92._12_4_ * 3.0;
    auVar240._16_4_ = fVar172 * auVar92._16_4_ * 3.0;
    auVar240._20_4_ = fVar172 * auVar92._20_4_ * 3.0;
    auVar240._24_4_ = fVar172 * auVar92._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar119._4_4_ = fVar172 * auVar93._4_4_ * 3.0;
    auVar119._0_4_ = fVar172 * auVar93._0_4_ * 3.0;
    auVar119._8_4_ = fVar172 * auVar93._8_4_ * 3.0;
    auVar119._12_4_ = fVar172 * auVar93._12_4_ * 3.0;
    auVar119._16_4_ = fVar172 * auVar93._16_4_ * 3.0;
    auVar119._20_4_ = fVar172 * auVar93._20_4_ * 3.0;
    auVar119._24_4_ = fVar172 * auVar93._24_4_ * 3.0;
    auVar119._28_4_ = auVar97._28_4_;
    fVar156 = auVar94._0_4_ * 3.0 * fVar172;
    fVar168 = auVar94._4_4_ * 3.0 * fVar172;
    auVar115._4_4_ = fVar168;
    auVar115._0_4_ = fVar156;
    fVar169 = auVar94._8_4_ * 3.0 * fVar172;
    auVar115._8_4_ = fVar169;
    fVar170 = auVar94._12_4_ * 3.0 * fVar172;
    auVar115._12_4_ = fVar170;
    fVar171 = auVar94._16_4_ * 3.0 * fVar172;
    auVar115._16_4_ = fVar171;
    fVar200 = auVar94._20_4_ * 3.0 * fVar172;
    auVar115._20_4_ = fVar200;
    fVar173 = auVar94._24_4_ * 3.0 * fVar172;
    auVar115._24_4_ = fVar173;
    auVar115._28_4_ = fVar172;
    auVar66 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar66);
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01feed00,ZEXT1632(auVar66));
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar66));
    auVar92 = ZEXT1632(auVar66);
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar92);
    auVar225._0_4_ = auVar91._0_4_ + fVar156;
    auVar225._4_4_ = auVar91._4_4_ + fVar168;
    auVar225._8_4_ = auVar91._8_4_ + fVar169;
    auVar225._12_4_ = auVar91._12_4_ + fVar170;
    auVar225._16_4_ = auVar91._16_4_ + fVar171;
    auVar225._20_4_ = auVar91._20_4_ + fVar200;
    auVar225._24_4_ = auVar91._24_4_ + fVar173;
    auVar225._28_4_ = auVar91._28_4_ + fVar172;
    auVar77 = vmaxps_avx(auVar91,auVar225);
    auVar100 = vminps_avx512vl(auVar91,auVar225);
    auVar101 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,auVar92);
    auVar102 = vpermt2ps_avx512vl(auVar238,_DAT_01feed00,auVar92);
    auVar103 = vpermt2ps_avx512vl(auVar240,_DAT_01feed00,auVar92);
    auVar114 = ZEXT1632(auVar66);
    auVar104 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar114);
    auVar91 = vpermt2ps_avx512vl(auVar115,_DAT_01feed00,auVar114);
    auVar91 = vsubps_avx(auVar101,auVar91);
    auVar92 = vsubps_avx(auVar97,ZEXT1632(auVar64));
    auVar93 = vsubps_avx(auVar98,auVar95);
    auVar94 = vsubps_avx(auVar99,auVar96);
    auVar105 = vmulps_avx512vl(auVar93,auVar119);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar240,auVar94);
    auVar106 = vmulps_avx512vl(auVar94,auVar238);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar119,auVar92);
    auVar107 = vmulps_avx512vl(auVar92,auVar240);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar238,auVar93);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar94,auVar94);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar93);
    auVar108 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar92);
    auVar106 = vrcp14ps_avx512vl(auVar108);
    auVar107 = vfnmadd213ps_avx512vl(auVar106,auVar108,auVar224);
    auVar106 = vfmadd132ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar105,auVar106);
    auVar107 = vmulps_avx512vl(auVar93,auVar104);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar103,auVar94);
    auVar109 = vmulps_avx512vl(auVar94,auVar102);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar92);
    auVar110 = vmulps_avx512vl(auVar92,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar102,auVar93);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar105 = vmaxps_avx512vl(auVar105,auVar106);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar106 = vmaxps_avx512vl(auVar91,auVar101);
    auVar77 = vmaxps_avx512vl(auVar77,auVar106);
    auVar109 = vaddps_avx512vl(auVar105,auVar77);
    auVar77 = vminps_avx(auVar91,auVar101);
    auVar77 = vminps_avx512vl(auVar100,auVar77);
    auVar77 = vsubps_avx512vl(auVar77,auVar105);
    auVar105._8_4_ = 0x3f800002;
    auVar105._0_8_ = 0x3f8000023f800002;
    auVar105._12_4_ = 0x3f800002;
    auVar105._16_4_ = 0x3f800002;
    auVar105._20_4_ = 0x3f800002;
    auVar105._24_4_ = 0x3f800002;
    auVar105._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar109,auVar105);
    auVar106._8_4_ = 0x3f7ffffc;
    auVar106._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar106._12_4_ = 0x3f7ffffc;
    auVar106._16_4_ = 0x3f7ffffc;
    auVar106._20_4_ = 0x3f7ffffc;
    auVar106._24_4_ = 0x3f7ffffc;
    auVar106._28_4_ = 0x3f7ffffc;
    auVar77 = vmulps_avx512vl(auVar77,auVar106);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar100 = vrsqrt14ps_avx512vl(auVar108);
    auVar107._8_4_ = 0xbf000000;
    auVar107._0_8_ = 0xbf000000bf000000;
    auVar107._12_4_ = 0xbf000000;
    auVar107._16_4_ = 0xbf000000;
    auVar107._20_4_ = 0xbf000000;
    auVar107._24_4_ = 0xbf000000;
    auVar107._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar108,auVar107);
    fVar156 = auVar100._0_4_;
    fVar168 = auVar100._4_4_;
    fVar169 = auVar100._8_4_;
    fVar170 = auVar100._12_4_;
    fVar172 = auVar100._16_4_;
    fVar171 = auVar100._20_4_;
    fVar200 = auVar100._24_4_;
    auVar116._4_4_ = fVar168 * fVar168 * fVar168 * auVar101._4_4_;
    auVar116._0_4_ = fVar156 * fVar156 * fVar156 * auVar101._0_4_;
    auVar116._8_4_ = fVar169 * fVar169 * fVar169 * auVar101._8_4_;
    auVar116._12_4_ = fVar170 * fVar170 * fVar170 * auVar101._12_4_;
    auVar116._16_4_ = fVar172 * fVar172 * fVar172 * auVar101._16_4_;
    auVar116._20_4_ = fVar171 * fVar171 * fVar171 * auVar101._20_4_;
    auVar116._24_4_ = fVar200 * fVar200 * fVar200 * auVar101._24_4_;
    auVar116._28_4_ = auVar109._28_4_;
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar116,auVar100,auVar108);
    auVar101 = vmulps_avx512vl(auVar92,auVar100);
    auVar105 = vmulps_avx512vl(auVar93,auVar100);
    auVar106 = vmulps_avx512vl(auVar94,auVar100);
    auVar217 = ZEXT1632(auVar64);
    auVar107 = vsubps_avx512vl(auVar114,auVar217);
    auVar108 = vsubps_avx512vl(auVar114,auVar95);
    auVar110 = vsubps_avx512vl(auVar114,auVar96);
    auVar109 = vmulps_avx512vl(auVar82,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_780,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_760,auVar107);
    auVar111 = vmulps_avx512vl(auVar110,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(auVar82,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,local_780);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,local_760);
    auVar106 = vmulps_avx512vl(auVar110,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar101);
    auVar105 = vmulps_avx512vl(auVar112,auVar112);
    auVar106 = vsubps_avx512vl(local_560,auVar105);
    auVar113 = vmulps_avx512vl(auVar112,auVar101);
    auVar109 = vsubps_avx512vl(auVar109,auVar113);
    auVar113 = vaddps_avx512vl(auVar109,auVar109);
    auVar109 = vmulps_avx512vl(auVar101,auVar101);
    auVar111 = vsubps_avx512vl(auVar111,auVar109);
    auVar91 = vsubps_avx512vl(auVar111,auVar91);
    local_7a0 = vmulps_avx512vl(auVar113,auVar113);
    auVar109._8_4_ = 0x40800000;
    auVar109._0_8_ = 0x4080000040800000;
    auVar109._12_4_ = 0x40800000;
    auVar109._16_4_ = 0x40800000;
    auVar109._20_4_ = 0x40800000;
    auVar109._24_4_ = 0x40800000;
    auVar109._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar106,auVar109);
    auVar109 = vmulps_avx512vl(_local_7c0,auVar91);
    auVar109 = vsubps_avx512vl(local_7a0,auVar109);
    uVar60 = vcmpps_avx512vl(auVar109,auVar114,5);
    bVar45 = (byte)uVar60;
    if (bVar45 == 0) {
      auVar155 = ZEXT3264(auVar224);
LAB_01d53ee1:
      auVar219 = ZEXT3264(local_8e0);
    }
    else {
      local_740._0_32_ = auVar111;
      auVar109 = vsqrtps_avx512vl(auVar109);
      auVar114 = vaddps_avx512vl(auVar106,auVar106);
      local_840 = vrcp14ps_avx512vl(auVar114);
      in_ZMM31 = ZEXT3264(local_840);
      auVar115 = vfnmadd213ps_avx512vl(local_840,auVar114,auVar224);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_840,local_840);
      auVar224._8_4_ = 0x80000000;
      auVar224._0_8_ = 0x8000000080000000;
      auVar224._12_4_ = 0x80000000;
      auVar224._16_4_ = 0x80000000;
      auVar224._20_4_ = 0x80000000;
      auVar224._24_4_ = 0x80000000;
      auVar224._28_4_ = 0x80000000;
      local_980 = vxorps_avx512vl(auVar113,auVar224);
      auVar116 = vsubps_avx512vl(local_980,auVar109);
      local_9c0 = vmulps_avx512vl(auVar116,auVar115);
      auVar109 = vsubps_avx512vl(auVar109,auVar113);
      local_7e0 = vmulps_avx512vl(auVar109,auVar115);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vblendmps_avx512vl(auVar109,local_9c0);
      auVar117._0_4_ =
           (uint)(bVar45 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar109._0_4_;
      bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar58 * auVar115._4_4_ | (uint)!bVar58 * auVar109._4_4_;
      bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar58 * auVar115._8_4_ | (uint)!bVar58 * auVar109._8_4_;
      bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar58 * auVar115._12_4_ | (uint)!bVar58 * auVar109._12_4_;
      bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar58 * auVar115._16_4_ | (uint)!bVar58 * auVar109._16_4_;
      bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar58 * auVar115._20_4_ | (uint)!bVar58 * auVar109._20_4_;
      bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar58 * auVar115._24_4_ | (uint)!bVar58 * auVar109._24_4_;
      bVar58 = SUB81(uVar60 >> 7,0);
      auVar117._28_4_ = (uint)bVar58 * auVar115._28_4_ | (uint)!bVar58 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar109,local_7e0);
      auVar118._0_4_ =
           (uint)(bVar45 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar109._0_4_;
      bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar58 * auVar115._4_4_ | (uint)!bVar58 * auVar109._4_4_;
      bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar58 * auVar115._8_4_ | (uint)!bVar58 * auVar109._8_4_;
      bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar58 * auVar115._12_4_ | (uint)!bVar58 * auVar109._12_4_;
      bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar58 * auVar115._16_4_ | (uint)!bVar58 * auVar109._16_4_;
      bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar58 * auVar115._20_4_ | (uint)!bVar58 * auVar109._20_4_;
      bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar58 * auVar115._24_4_ | (uint)!bVar58 * auVar109._24_4_;
      bVar58 = SUB81(uVar60 >> 7,0);
      auVar118._28_4_ = (uint)bVar58 * auVar115._28_4_ | (uint)!bVar58 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar109);
      local_800 = vmaxps_avx512vl(local_580,auVar109);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar27);
      vandps_avx512vl(auVar106,auVar109);
      uVar53 = vcmpps_avx512vl(local_820,local_820,1);
      uVar60 = uVar60 & uVar53;
      bVar52 = (byte)uVar60;
      if (bVar52 != 0) {
        uVar53 = vcmpps_avx512vl(auVar91,_DAT_01faff00,2);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar91,auVar105);
        bVar48 = (byte)uVar53;
        uVar62 = (uint)(bVar48 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar48 & 1) * local_820._0_4_;
        bVar58 = (bool)((byte)(uVar53 >> 1) & 1);
        uVar61 = (uint)bVar58 * auVar106._4_4_ | (uint)!bVar58 * local_820._4_4_;
        bVar58 = (bool)((byte)(uVar53 >> 2) & 1);
        uVar134 = (uint)bVar58 * auVar106._8_4_ | (uint)!bVar58 * local_820._8_4_;
        bVar58 = (bool)((byte)(uVar53 >> 3) & 1);
        uVar135 = (uint)bVar58 * auVar106._12_4_ | (uint)!bVar58 * local_820._12_4_;
        bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
        uVar136 = (uint)bVar58 * auVar106._16_4_ | (uint)!bVar58 * local_820._16_4_;
        bVar58 = (bool)((byte)(uVar53 >> 5) & 1);
        uVar137 = (uint)bVar58 * auVar106._20_4_ | (uint)!bVar58 * local_820._20_4_;
        bVar58 = (bool)((byte)(uVar53 >> 6) & 1);
        uVar138 = (uint)bVar58 * auVar106._24_4_ | (uint)!bVar58 * local_820._24_4_;
        bVar58 = SUB81(uVar53 >> 7,0);
        uVar139 = (uint)bVar58 * auVar106._28_4_ | (uint)!bVar58 * local_820._28_4_;
        auVar117._0_4_ = (bVar52 & 1) * uVar62 | !(bool)(bVar52 & 1) * auVar117._0_4_;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar117._4_4_ = bVar58 * uVar61 | !bVar58 * auVar117._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar117._8_4_ = bVar58 * uVar134 | !bVar58 * auVar117._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar117._12_4_ = bVar58 * uVar135 | !bVar58 * auVar117._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar117._16_4_ = bVar58 * uVar136 | !bVar58 * auVar117._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar117._20_4_ = bVar58 * uVar137 | !bVar58 * auVar117._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar117._24_4_ = bVar58 * uVar138 | !bVar58 * auVar117._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar117._28_4_ = bVar58 * uVar139 | !bVar58 * auVar117._28_4_;
        auVar91 = vblendmps_avx512vl(auVar105,auVar91);
        bVar58 = (bool)((byte)(uVar53 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar53 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar53 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
        bVar11 = SUB81(uVar53 >> 7,0);
        auVar118._0_4_ =
             (uint)(bVar52 & 1) *
             ((uint)(bVar48 & 1) * auVar91._0_4_ | !(bool)(bVar48 & 1) * uVar62) |
             !(bool)(bVar52 & 1) * auVar118._0_4_;
        bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar5 * ((uint)bVar58 * auVar91._4_4_ | !bVar58 * uVar61) |
             !bVar5 * auVar118._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar58 * ((uint)bVar6 * auVar91._8_4_ | !bVar6 * uVar134) |
             !bVar58 * auVar118._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar118._12_4_ =
             (uint)bVar58 * ((uint)bVar7 * auVar91._12_4_ | !bVar7 * uVar135) |
             !bVar58 * auVar118._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar118._16_4_ =
             (uint)bVar58 * ((uint)bVar8 * auVar91._16_4_ | !bVar8 * uVar136) |
             !bVar58 * auVar118._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar118._20_4_ =
             (uint)bVar58 * ((uint)bVar9 * auVar91._20_4_ | !bVar9 * uVar137) |
             !bVar58 * auVar118._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar118._24_4_ =
             (uint)bVar58 * ((uint)bVar10 * auVar91._24_4_ | !bVar10 * uVar138) |
             !bVar58 * auVar118._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar118._28_4_ =
             (uint)bVar58 * ((uint)bVar11 * auVar91._28_4_ | !bVar11 * uVar139) |
             !bVar58 * auVar118._28_4_;
        bVar45 = (~bVar52 | bVar48) & bVar45;
      }
      if ((bVar45 & 0x7f) == 0) {
        auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01d53ee1;
      }
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = vxorps_avx512vl(auVar104,auVar91);
      auVar102 = vxorps_avx512vl(auVar102,auVar91);
      uVar62 = *(uint *)(ray + k * 4 + 0x200);
      auVar103 = vxorps_avx512vl(auVar103,auVar91);
      auVar66 = vsubss_avx512f(ZEXT416(uVar62),ZEXT416((uint)local_950._0_4_));
      auVar105 = vbroadcastss_avx512vl(auVar66);
      auVar105 = vminps_avx512vl(auVar105,auVar118);
      auVar44._4_4_ = fStack_5bc;
      auVar44._0_4_ = local_5c0;
      auVar44._8_4_ = fStack_5b8;
      auVar44._12_4_ = fStack_5b4;
      auVar44._16_4_ = fStack_5b0;
      auVar44._20_4_ = fStack_5ac;
      auVar44._24_4_ = fStack_5a8;
      auVar44._28_4_ = fStack_5a4;
      auVar106 = vmaxps_avx512vl(auVar44,auVar117);
      auVar109 = vmulps_avx512vl(auVar110,auVar119);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar240,auVar109);
      auVar66 = vfmadd213ps_fma(auVar107,auVar238,auVar108);
      in_ZMM31 = ZEXT3264(auVar82);
      auVar107 = vmulps_avx512vl(auVar82,auVar119);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_780,auVar240);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_760,auVar238);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar108);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar108,auVar109,1);
      auVar110 = vxorps_avx512vl(ZEXT1632(auVar66),auVar91);
      auVar119 = vrcp14ps_avx512vl(auVar107);
      auVar115 = vxorps_avx512vl(auVar107,auVar91);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar120 = vfnmadd213ps_avx512vl(auVar119,auVar107,auVar116);
      auVar66 = vfmadd132ps_fma(auVar120,auVar119,auVar119);
      fVar156 = auVar66._0_4_ * auVar110._0_4_;
      fVar168 = auVar66._4_4_ * auVar110._4_4_;
      auVar33._4_4_ = fVar168;
      auVar33._0_4_ = fVar156;
      fVar169 = auVar66._8_4_ * auVar110._8_4_;
      auVar33._8_4_ = fVar169;
      fVar170 = auVar66._12_4_ * auVar110._12_4_;
      auVar33._12_4_ = fVar170;
      fVar172 = auVar110._16_4_ * 0.0;
      auVar33._16_4_ = fVar172;
      fVar171 = auVar110._20_4_ * 0.0;
      auVar33._20_4_ = fVar171;
      fVar200 = auVar110._24_4_ * 0.0;
      auVar33._24_4_ = fVar200;
      auVar33._28_4_ = auVar110._28_4_;
      uVar15 = vcmpps_avx512vl(auVar107,auVar115,1);
      bVar52 = (byte)uVar14 | (byte)uVar15;
      auVar235._8_4_ = 0xff800000;
      auVar235._0_8_ = 0xff800000ff800000;
      auVar235._12_4_ = 0xff800000;
      auVar235._16_4_ = 0xff800000;
      auVar235._20_4_ = 0xff800000;
      auVar235._24_4_ = 0xff800000;
      auVar235._28_4_ = 0xff800000;
      auVar120 = vblendmps_avx512vl(auVar33,auVar235);
      auVar121._0_4_ =
           (uint)(bVar52 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar119._0_4_;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar58 * auVar120._4_4_ | (uint)!bVar58 * auVar119._4_4_;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar58 * auVar120._8_4_ | (uint)!bVar58 * auVar119._8_4_;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar58 * auVar120._12_4_ | (uint)!bVar58 * auVar119._12_4_;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar58 * auVar120._16_4_ | (uint)!bVar58 * auVar119._16_4_;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar58 * auVar120._20_4_ | (uint)!bVar58 * auVar119._20_4_;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar58 * auVar120._24_4_ | (uint)!bVar58 * auVar119._24_4_;
      auVar121._28_4_ =
           (uint)(bVar52 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar52 >> 7) * auVar119._28_4_;
      auVar119 = vmaxps_avx512vl(auVar106,auVar121);
      uVar15 = vcmpps_avx512vl(auVar107,auVar115,6);
      bVar52 = (byte)uVar14 | (byte)uVar15;
      auVar122._0_4_ = (uint)(bVar52 & 1) * 0x7f800000 | (uint)!(bool)(bVar52 & 1) * (int)fVar156;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar168;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar169;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar170;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar172;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar171;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar200;
      auVar122._28_4_ =
           (uint)(bVar52 >> 7) * 0x7f800000 | (uint)!(bool)(bVar52 >> 7) * auVar110._28_4_;
      auVar105 = vminps_avx512vl(auVar105,auVar122);
      auVar66 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar66),auVar97);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar66),auVar98);
      auVar106 = ZEXT1632(auVar66);
      auVar99 = vsubps_avx512vl(auVar106,auVar99);
      auVar99 = vmulps_avx512vl(auVar99,auVar104);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar98);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar97);
      auVar98 = vmulps_avx512vl(auVar82,auVar104);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_780,auVar103);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_760,auVar102);
      vandps_avx512vl(auVar98,auVar108);
      uVar14 = vcmpps_avx512vl(auVar98,auVar109,1);
      auVar97 = vxorps_avx512vl(auVar97,auVar91);
      auVar99 = vrcp14ps_avx512vl(auVar98);
      auVar102 = vxorps_avx512vl(auVar98,auVar91);
      auVar91 = vfnmadd213ps_avx512vl(auVar99,auVar98,auVar116);
      auVar66 = vfmadd132ps_fma(auVar91,auVar99,auVar99);
      fVar156 = auVar66._0_4_ * auVar97._0_4_;
      fVar168 = auVar66._4_4_ * auVar97._4_4_;
      auVar34._4_4_ = fVar168;
      auVar34._0_4_ = fVar156;
      fVar169 = auVar66._8_4_ * auVar97._8_4_;
      auVar34._8_4_ = fVar169;
      fVar170 = auVar66._12_4_ * auVar97._12_4_;
      auVar34._12_4_ = fVar170;
      fVar172 = auVar97._16_4_ * 0.0;
      auVar34._16_4_ = fVar172;
      fVar171 = auVar97._20_4_ * 0.0;
      auVar34._20_4_ = fVar171;
      fVar200 = auVar97._24_4_ * 0.0;
      auVar34._24_4_ = fVar200;
      auVar34._28_4_ = auVar97._28_4_;
      uVar15 = vcmpps_avx512vl(auVar98,auVar102,1);
      bVar52 = (byte)uVar14 | (byte)uVar15;
      auVar91 = vblendmps_avx512vl(auVar34,auVar235);
      auVar123._0_4_ =
           (uint)(bVar52 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar99._0_4_;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar58 * auVar91._4_4_ | (uint)!bVar58 * auVar99._4_4_;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar58 * auVar91._8_4_ | (uint)!bVar58 * auVar99._8_4_;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar58 * auVar91._12_4_ | (uint)!bVar58 * auVar99._12_4_;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar58 * auVar91._16_4_ | (uint)!bVar58 * auVar99._16_4_;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar58 * auVar91._20_4_ | (uint)!bVar58 * auVar99._20_4_;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar58 * auVar91._24_4_ | (uint)!bVar58 * auVar99._24_4_;
      auVar123._28_4_ =
           (uint)(bVar52 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar52 >> 7) * auVar99._28_4_;
      auVar91 = vmaxps_avx(auVar119,auVar123);
      uVar15 = vcmpps_avx512vl(auVar98,auVar102,6);
      bVar52 = (byte)uVar14 | (byte)uVar15;
      auVar124._0_4_ = (uint)(bVar52 & 1) * 0x7f800000 | (uint)!(bool)(bVar52 & 1) * (int)fVar156;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar168;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar169;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar170;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar172;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar171;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar200;
      auVar124._28_4_ =
           (uint)(bVar52 >> 7) * 0x7f800000 | (uint)!(bool)(bVar52 >> 7) * auVar97._28_4_;
      local_640 = vminps_avx(auVar105,auVar124);
      uVar14 = vcmpps_avx512vl(auVar91,local_640,2);
      bVar45 = bVar45 & 0x7f & (byte)uVar14;
      if (bVar45 == 0) {
        auVar155 = ZEXT3264(auVar116);
        goto LAB_01d53ee1;
      }
      auVar97 = vmaxps_avx512vl(auVar106,auVar77);
      auVar77 = vfmadd213ps_avx512vl(local_9c0,auVar112,auVar101);
      fVar156 = auVar100._0_4_;
      fVar168 = auVar100._4_4_;
      auVar35._4_4_ = fVar168 * auVar77._4_4_;
      auVar35._0_4_ = fVar156 * auVar77._0_4_;
      fVar169 = auVar100._8_4_;
      auVar35._8_4_ = fVar169 * auVar77._8_4_;
      fVar170 = auVar100._12_4_;
      auVar35._12_4_ = fVar170 * auVar77._12_4_;
      fVar172 = auVar100._16_4_;
      auVar35._16_4_ = fVar172 * auVar77._16_4_;
      fVar171 = auVar100._20_4_;
      auVar35._20_4_ = fVar171 * auVar77._20_4_;
      fVar200 = auVar100._24_4_;
      auVar35._24_4_ = fVar200 * auVar77._24_4_;
      auVar35._28_4_ = auVar77._28_4_;
      auVar77 = vfmadd213ps_avx512vl(local_7e0,auVar112,auVar101);
      auVar36._4_4_ = fVar168 * auVar77._4_4_;
      auVar36._0_4_ = fVar156 * auVar77._0_4_;
      auVar36._8_4_ = fVar169 * auVar77._8_4_;
      auVar36._12_4_ = fVar170 * auVar77._12_4_;
      auVar36._16_4_ = fVar172 * auVar77._16_4_;
      auVar36._20_4_ = fVar171 * auVar77._20_4_;
      auVar36._24_4_ = fVar200 * auVar77._24_4_;
      auVar36._28_4_ = auVar123._28_4_;
      auVar77 = vminps_avx512vl(auVar35,auVar116);
      auVar98 = ZEXT832(0) << 0x20;
      auVar77 = vmaxps_avx(auVar77,ZEXT832(0) << 0x20);
      auVar99 = vminps_avx512vl(auVar36,auVar116);
      auVar37._4_4_ = (auVar77._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar77._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar77._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar77._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar77._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar77._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar77._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar77._28_4_ + 7.0;
      auVar66 = vfmadd213ps_fma(auVar37,auVar233,auVar212);
      local_520 = ZEXT1632(auVar66);
      auVar77 = vmaxps_avx(auVar99,ZEXT832(0) << 0x20);
      auVar38._4_4_ = (auVar77._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar77._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar77._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar77._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar77._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar77._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar77._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar77._28_4_ + 7.0;
      auVar66 = vfmadd213ps_fma(auVar38,auVar233,auVar212);
      local_540 = ZEXT1632(auVar66);
      auVar39._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar39._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar39._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar39._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar39._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar39._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar39._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar39._28_4_ = auVar97._28_4_;
      auVar77 = vsubps_avx(auVar111,auVar39);
      auVar40._4_4_ = auVar77._4_4_ * (float)local_7c0._4_4_;
      auVar40._0_4_ = auVar77._0_4_ * (float)local_7c0._0_4_;
      auVar40._8_4_ = auVar77._8_4_ * fStack_7b8;
      auVar40._12_4_ = auVar77._12_4_ * fStack_7b4;
      auVar40._16_4_ = auVar77._16_4_ * fStack_7b0;
      auVar40._20_4_ = auVar77._20_4_ * fStack_7ac;
      auVar40._24_4_ = auVar77._24_4_ * fStack_7a8;
      auVar40._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(local_7a0,auVar40);
      uVar14 = vcmpps_avx512vl(auVar97,ZEXT832(0) << 0x20,5);
      bVar52 = (byte)uVar14;
      if (bVar52 == 0) {
        bVar52 = 0;
        auVar92 = ZEXT832(0) << 0x20;
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
      }
      else {
        uVar60 = vcmpps_avx512vl(auVar97,auVar106,5);
        auVar97 = vsqrtps_avx(auVar97);
        auVar98 = vfnmadd213ps_avx512vl(auVar114,local_840,auVar116);
        auVar102 = vfmadd132ps_avx512vl(auVar98,local_840,local_840);
        auVar98 = vsubps_avx(local_980,auVar97);
        auVar103 = vmulps_avx512vl(auVar98,auVar102);
        auVar97 = vsubps_avx512vl(auVar97,auVar113);
        auVar104 = vmulps_avx512vl(auVar97,auVar102);
        auVar97 = vfmadd213ps_avx512vl(auVar112,auVar103,auVar101);
        auVar41._4_4_ = fVar168 * auVar97._4_4_;
        auVar41._0_4_ = fVar156 * auVar97._0_4_;
        auVar41._8_4_ = fVar169 * auVar97._8_4_;
        auVar41._12_4_ = fVar170 * auVar97._12_4_;
        auVar41._16_4_ = fVar172 * auVar97._16_4_;
        auVar41._20_4_ = fVar171 * auVar97._20_4_;
        auVar41._24_4_ = fVar200 * auVar97._24_4_;
        auVar41._28_4_ = auVar99._28_4_;
        auVar97 = vmulps_avx512vl(local_760,auVar103);
        auVar98 = vmulps_avx512vl(local_780,auVar103);
        auVar105 = vmulps_avx512vl(auVar82,auVar103);
        auVar99 = vfmadd213ps_avx512vl(auVar92,auVar41,auVar217);
        auVar99 = vsubps_avx512vl(auVar97,auVar99);
        auVar97 = vfmadd213ps_avx512vl(auVar93,auVar41,auVar95);
        auVar102 = vsubps_avx512vl(auVar98,auVar97);
        auVar66 = vfmadd213ps_fma(auVar41,auVar94,auVar96);
        auVar97 = vsubps_avx(auVar105,ZEXT1632(auVar66));
        auVar98 = vfmadd213ps_avx512vl(auVar112,auVar104,auVar101);
        auVar100 = vmulps_avx512vl(auVar100,auVar98);
        auVar98 = vmulps_avx512vl(local_760,auVar104);
        auVar101 = vmulps_avx512vl(local_780,auVar104);
        auVar105 = vmulps_avx512vl(auVar82,auVar104);
        auVar66 = vfmadd213ps_fma(auVar92,auVar100,auVar217);
        auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar93,auVar100,auVar95);
        auVar92 = vsubps_avx512vl(auVar101,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar94,auVar100,auVar96);
        auVar93 = vsubps_avx512vl(auVar105,ZEXT1632(auVar66));
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar196,auVar103);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar125._0_4_ = (uint)bVar58 * auVar94._0_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar58 * auVar94._4_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar58 * auVar94._8_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar58 * auVar94._12_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar58 * auVar94._16_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar58 * auVar94._20_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar58 * auVar94._24_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar125._28_4_ = (uint)bVar58 * auVar94._28_4_ | (uint)!bVar58 * 0x7f800000;
        auVar218._8_4_ = 0xff800000;
        auVar218._0_8_ = 0xff800000ff800000;
        auVar218._12_4_ = 0xff800000;
        auVar218._16_4_ = 0xff800000;
        auVar218._20_4_ = 0xff800000;
        auVar218._24_4_ = 0xff800000;
        auVar218._28_4_ = 0xff800000;
        auVar94 = vblendmps_avx512vl(auVar218,auVar104);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar126._0_4_ = (uint)bVar58 * auVar94._0_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar58 * auVar94._4_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar58 * auVar94._8_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar58 * auVar94._12_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar58 * auVar94._16_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar58 * auVar94._20_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar58 * auVar94._24_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar126._28_4_ = (uint)bVar58 * auVar94._28_4_ | (uint)!bVar58 * -0x800000;
        auVar28._8_4_ = 0x36000000;
        auVar28._0_8_ = 0x3600000036000000;
        auVar28._12_4_ = 0x36000000;
        auVar28._16_4_ = 0x36000000;
        auVar28._20_4_ = 0x36000000;
        auVar28._24_4_ = 0x36000000;
        auVar28._28_4_ = 0x36000000;
        auVar94 = vmulps_avx512vl(local_800,auVar28);
        uVar53 = vcmpps_avx512vl(auVar94,local_820,0xe);
        uVar60 = uVar60 & uVar53;
        bVar48 = (byte)uVar60;
        if (bVar48 != 0) {
          uVar53 = vcmpps_avx512vl(auVar77,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          auVar77 = vblendmps_avx512vl(auVar234,auVar236);
          bVar55 = (byte)uVar53;
          uVar61 = (uint)(bVar55 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar94._0_4_;
          bVar58 = (bool)((byte)(uVar53 >> 1) & 1);
          uVar134 = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * auVar94._4_4_;
          bVar58 = (bool)((byte)(uVar53 >> 2) & 1);
          uVar135 = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * auVar94._8_4_;
          bVar58 = (bool)((byte)(uVar53 >> 3) & 1);
          uVar136 = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * auVar94._12_4_;
          bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
          uVar137 = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * auVar94._16_4_;
          bVar58 = (bool)((byte)(uVar53 >> 5) & 1);
          uVar138 = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * auVar94._20_4_;
          bVar58 = (bool)((byte)(uVar53 >> 6) & 1);
          uVar139 = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * auVar94._24_4_;
          bVar58 = SUB81(uVar53 >> 7,0);
          uVar140 = (uint)bVar58 * auVar77._28_4_ | (uint)!bVar58 * auVar94._28_4_;
          auVar125._0_4_ = (bVar48 & 1) * uVar61 | !(bool)(bVar48 & 1) * auVar125._0_4_;
          bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar125._4_4_ = bVar58 * uVar134 | !bVar58 * auVar125._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar125._8_4_ = bVar58 * uVar135 | !bVar58 * auVar125._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar125._12_4_ = bVar58 * uVar136 | !bVar58 * auVar125._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar125._16_4_ = bVar58 * uVar137 | !bVar58 * auVar125._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar125._20_4_ = bVar58 * uVar138 | !bVar58 * auVar125._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar125._24_4_ = bVar58 * uVar139 | !bVar58 * auVar125._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar125._28_4_ = bVar58 * uVar140 | !bVar58 * auVar125._28_4_;
          auVar77 = vblendmps_avx512vl(auVar236,auVar234);
          bVar58 = (bool)((byte)(uVar53 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar53 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar53 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
          bVar11 = SUB81(uVar53 >> 7,0);
          auVar126._0_4_ =
               (uint)(bVar48 & 1) *
               ((uint)(bVar55 & 1) * auVar77._0_4_ | !(bool)(bVar55 & 1) * uVar61) |
               !(bool)(bVar48 & 1) * auVar126._0_4_;
          bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar126._4_4_ =
               (uint)bVar5 * ((uint)bVar58 * auVar77._4_4_ | !bVar58 * uVar134) |
               !bVar5 * auVar126._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar126._8_4_ =
               (uint)bVar58 * ((uint)bVar6 * auVar77._8_4_ | !bVar6 * uVar135) |
               !bVar58 * auVar126._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar126._12_4_ =
               (uint)bVar58 * ((uint)bVar7 * auVar77._12_4_ | !bVar7 * uVar136) |
               !bVar58 * auVar126._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar126._16_4_ =
               (uint)bVar58 * ((uint)bVar8 * auVar77._16_4_ | !bVar8 * uVar137) |
               !bVar58 * auVar126._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar126._20_4_ =
               (uint)bVar58 * ((uint)bVar9 * auVar77._20_4_ | !bVar9 * uVar138) |
               !bVar58 * auVar126._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar126._24_4_ =
               (uint)bVar58 * ((uint)bVar10 * auVar77._24_4_ | !bVar10 * uVar139) |
               !bVar58 * auVar126._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar126._28_4_ =
               (uint)bVar58 * ((uint)bVar11 * auVar77._28_4_ | !bVar11 * uVar140) |
               !bVar58 * auVar126._28_4_;
          bVar52 = (~bVar48 | bVar55) & bVar52;
        }
      }
      auVar77 = vmulps_avx512vl(auVar82,auVar93);
      auVar66 = vfmadd231ps_fma(auVar77,local_780,auVar92);
      auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),local_760,auVar98);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar77 = vandps_avx(ZEXT1632(auVar66),auVar230);
      _local_440 = auVar91;
      auVar226._8_4_ = 0x3e99999a;
      auVar226._0_8_ = 0x3e99999a3e99999a;
      auVar226._12_4_ = 0x3e99999a;
      auVar226._16_4_ = 0x3e99999a;
      auVar226._20_4_ = 0x3e99999a;
      auVar226._24_4_ = 0x3e99999a;
      auVar226._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar77,auVar226,1);
      local_6c0._0_2_ = (short)uVar14;
      local_660 = vmaxps_avx(auVar91,auVar126);
      auVar77 = vminps_avx(local_640,auVar125);
      uVar14 = vcmpps_avx512vl(auVar91,auVar77,2);
      bVar48 = (byte)uVar14 & bVar45;
      uVar15 = vcmpps_avx512vl(local_660,local_640,2);
      if ((bVar45 & ((byte)uVar15 | (byte)uVar14)) == 0) {
        auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar219 = ZEXT3264(local_8e0);
      }
      else {
        auVar77 = vmulps_avx512vl(auVar82,auVar97);
        auVar66 = vfmadd213ps_fma(auVar102,local_780,auVar77);
        auVar66 = vfmadd213ps_fma(auVar99,local_760,ZEXT1632(auVar66));
        auVar77 = vandps_avx(ZEXT1632(auVar66),auVar230);
        uVar14 = vcmpps_avx512vl(auVar77,auVar226,1);
        bVar55 = (byte)uVar14 | ~bVar52;
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar151,auVar29);
        local_600._0_4_ = (uint)(bVar55 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar58 = (bool)(bVar55 >> 1 & 1);
        local_600._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 2 & 1);
        local_600._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 3 & 1);
        local_600._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 4 & 1);
        local_600._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 5 & 1);
        local_600._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 6 & 1);
        local_600._24_4_ = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * 2;
        local_600._28_4_ = (uint)(bVar55 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2;
        local_680 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_680,local_600,5);
        bVar55 = (byte)uVar14 & bVar48;
        auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        if (bVar55 == 0) {
          auVar153._4_4_ = uVar62;
          auVar153._0_4_ = uVar62;
          auVar153._8_4_ = uVar62;
          auVar153._12_4_ = uVar62;
          auVar153._16_4_ = uVar62;
          auVar153._20_4_ = uVar62;
          auVar153._24_4_ = uVar62;
          auVar153._28_4_ = uVar62;
          auVar77 = local_660;
        }
        else {
          local_620 = local_660;
          auVar1 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar66 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar63 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar71 = vminps_avx(auVar1,auVar63);
          auVar1 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar63 = vmaxps_avx(auVar66,auVar1);
          auVar74._8_4_ = 0x7fffffff;
          auVar74._0_8_ = 0x7fffffff7fffffff;
          auVar74._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar71,auVar74);
          auVar1 = vandps_avx(auVar63,auVar74);
          auVar66 = vmaxps_avx(auVar66,auVar1);
          auVar1 = vmovshdup_avx(auVar66);
          auVar1 = vmaxss_avx(auVar1,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar1);
          fVar156 = auVar66._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar63,auVar63,0xff);
          local_c60 = auVar91._0_4_;
          fStack_c5c = auVar91._4_4_;
          fStack_c58 = auVar91._8_4_;
          fStack_c54 = auVar91._12_4_;
          fStack_c50 = auVar91._16_4_;
          fStack_c4c = auVar91._20_4_;
          fStack_c48 = auVar91._24_4_;
          fStack_c44 = auVar91._28_4_;
          local_6a0 = local_c60 + fVar141;
          fStack_69c = fStack_c5c + fVar141;
          fStack_698 = fStack_c58 + fVar141;
          fStack_694 = fStack_c54 + fVar141;
          fStack_690 = fStack_c50 + fVar141;
          fStack_68c = fStack_c4c + fVar141;
          fStack_688 = fStack_c48 + fVar141;
          fStack_684 = fStack_c44 + fVar141;
          do {
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar77 = vblendmps_avx512vl(auVar152,auVar91);
            auVar128._0_4_ =
                 (uint)(bVar55 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar55 >> 1 & 1);
            auVar128._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar55 >> 2 & 1);
            auVar128._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar55 >> 3 & 1);
            auVar128._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar55 >> 4 & 1);
            auVar128._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar55 >> 5 & 1);
            auVar128._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 0x7f800000;
            auVar128._24_4_ =
                 (uint)(bVar55 >> 6) * auVar77._24_4_ | (uint)!(bool)(bVar55 >> 6) * 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar77 = vshufps_avx(auVar128,auVar128,0xb1);
            auVar77 = vminps_avx(auVar128,auVar77);
            auVar92 = vshufpd_avx(auVar77,auVar77,5);
            auVar77 = vminps_avx(auVar77,auVar92);
            auVar92 = vpermpd_avx2(auVar77,0x4e);
            auVar77 = vminps_avx(auVar77,auVar92);
            uVar14 = vcmpps_avx512vl(auVar128,auVar77,0);
            bVar46 = (byte)uVar14 & bVar55;
            bVar47 = bVar55;
            if (bVar46 != 0) {
              bVar47 = bVar46;
            }
            iVar17 = 0;
            for (uVar62 = (uint)bVar47; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar62 = *(uint *)(local_520 + (uint)(iVar17 << 2));
            uVar61 = *(uint *)(local_440 + (uint)(iVar17 << 2));
            fVar168 = auVar12._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              fVar168 = sqrtf((float)local_9a0._0_4_);
            }
            auVar66 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar62),0x10);
            auVar219 = ZEXT1664(auVar66);
            bVar58 = true;
            uVar60 = 0;
            do {
              uVar142 = auVar219._0_4_;
              auVar143._4_4_ = uVar142;
              auVar143._0_4_ = uVar142;
              auVar143._8_4_ = uVar142;
              auVar143._12_4_ = uVar142;
              auVar1 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_990);
              auVar63 = auVar219._0_16_;
              auVar66 = vmovshdup_avx(auVar63);
              local_7e0._0_16_ = auVar66;
              fVar200 = 1.0 - auVar66._0_4_;
              auVar66 = vshufps_avx(auVar63,auVar63,0x55);
              fVar169 = auVar66._0_4_;
              auVar175._0_4_ = local_8a0._0_4_ * fVar169;
              fVar170 = auVar66._4_4_;
              auVar175._4_4_ = local_8a0._4_4_ * fVar170;
              fVar172 = auVar66._8_4_;
              auVar175._8_4_ = local_8a0._8_4_ * fVar172;
              fVar171 = auVar66._12_4_;
              auVar175._12_4_ = local_8a0._12_4_ * fVar171;
              _local_7c0 = ZEXT416((uint)fVar200);
              auVar202._4_4_ = fVar200;
              auVar202._0_4_ = fVar200;
              auVar202._8_4_ = fVar200;
              auVar202._12_4_ = fVar200;
              auVar66 = vfmadd231ps_fma(auVar175,auVar202,local_860._0_16_);
              auVar213._0_4_ = local_880._0_4_ * fVar169;
              auVar213._4_4_ = local_880._4_4_ * fVar170;
              auVar213._8_4_ = local_880._8_4_ * fVar172;
              auVar213._12_4_ = local_880._12_4_ * fVar171;
              auVar63 = vfmadd231ps_fma(auVar213,auVar202,local_8a0._0_16_);
              auVar220._0_4_ = fVar169 * (float)local_8c0._0_4_;
              auVar220._4_4_ = fVar170 * (float)local_8c0._4_4_;
              auVar220._8_4_ = fVar172 * fStack_8b8;
              auVar220._12_4_ = fVar171 * fStack_8b4;
              auVar71 = vfmadd231ps_fma(auVar220,auVar202,local_880._0_16_);
              auVar227._0_4_ = fVar169 * auVar63._0_4_;
              auVar227._4_4_ = fVar170 * auVar63._4_4_;
              auVar227._8_4_ = fVar172 * auVar63._8_4_;
              auVar227._12_4_ = fVar171 * auVar63._12_4_;
              auVar66 = vfmadd231ps_fma(auVar227,auVar202,auVar66);
              auVar176._0_4_ = fVar169 * auVar71._0_4_;
              auVar176._4_4_ = fVar170 * auVar71._4_4_;
              auVar176._8_4_ = fVar172 * auVar71._8_4_;
              auVar176._12_4_ = fVar171 * auVar71._12_4_;
              auVar63 = vfmadd231ps_fma(auVar176,auVar202,auVar63);
              auVar214._0_4_ = fVar169 * auVar63._0_4_;
              auVar214._4_4_ = fVar170 * auVar63._4_4_;
              auVar214._8_4_ = fVar172 * auVar63._8_4_;
              auVar214._12_4_ = fVar171 * auVar63._12_4_;
              auVar71 = vfmadd231ps_fma(auVar214,auVar66,auVar202);
              auVar66 = vsubps_avx(auVar63,auVar66);
              auVar75._8_4_ = 0x40400000;
              auVar75._0_8_ = 0x4040000040400000;
              auVar75._12_4_ = 0x40400000;
              auVar63 = vmulps_avx512vl(auVar66,auVar75);
              local_7a0._0_16_ = auVar71;
              auVar1 = vsubps_avx(auVar1,auVar71);
              auVar66 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar169 = auVar66._0_4_;
              local_740 = auVar219;
              if (fVar169 < 0.0) {
                auVar155._0_4_ = sqrtf(fVar169);
                auVar155._4_60_ = extraout_var;
                auVar71 = auVar155._0_16_;
              }
              else {
                auVar71 = vsqrtss_avx(auVar66,auVar66);
              }
              local_800._0_16_ = vdpps_avx(auVar63,auVar63,0x7f);
              fVar170 = local_800._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar170;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              fVar172 = local_9c0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar64 = vxorps_avx512vl(local_800._0_16_,auVar18);
              auVar67 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar67._0_4_;
              local_980._0_4_ = auVar71._0_4_;
              if (fVar170 < auVar64._0_4_) {
                fVar171 = sqrtf(fVar170);
                auVar71 = ZEXT416((uint)local_980._0_4_);
              }
              else {
                auVar67 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar171 = auVar67._0_4_;
              }
              fVar200 = local_9c0._0_4_;
              fVar170 = fVar172 * 1.5 + fVar170 * -0.5 * fVar200 * fVar200 * fVar200;
              auVar144._0_4_ = auVar63._0_4_ * fVar170;
              auVar144._4_4_ = auVar63._4_4_ * fVar170;
              auVar144._8_4_ = auVar63._8_4_ * fVar170;
              auVar144._12_4_ = auVar63._12_4_ * fVar170;
              local_9c0._0_16_ = vdpps_avx(auVar1,auVar144,0x7f);
              auVar64 = vaddss_avx512f(auVar71,ZEXT416(0x3f800000));
              auVar145._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
              auVar145._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
              auVar145._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
              auVar145._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
              auVar66 = vsubps_avx(auVar66,auVar145);
              fVar172 = auVar66._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar172;
              auVar67 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar68 = vmulss_avx512f(auVar67,ZEXT416(0x3fc00000));
              auVar69 = vmulss_avx512f(auVar66,ZEXT416(0xbf000000));
              uVar59 = fVar172 == 0.0;
              uVar57 = fVar172 < 0.0;
              if ((bool)uVar57) {
                local_900._0_4_ = fVar171;
                local_920._0_4_ = auVar68._0_4_;
                local_930._4_4_ = fVar170;
                local_930._0_4_ = fVar170;
                fStack_928 = fVar170;
                fStack_924 = fVar170;
                local_910 = auVar67;
                fVar172 = sqrtf(fVar172);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar68 = ZEXT416((uint)local_920._0_4_);
                auVar71 = ZEXT416((uint)local_980._0_4_);
                auVar64 = ZEXT416(auVar64._0_4_);
                auVar67 = local_910;
                fVar170 = (float)local_930._0_4_;
                fVar200 = (float)local_930._4_4_;
                fVar173 = fStack_928;
                fVar239 = fStack_924;
                fVar171 = (float)local_900._0_4_;
              }
              else {
                auVar66 = vsqrtss_avx(auVar66,auVar66);
                fVar172 = auVar66._0_4_;
                fVar200 = fVar170;
                fVar173 = fVar170;
                fVar239 = fVar170;
              }
              auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar66 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar174 = auVar66._0_4_ * 6.0;
              fVar13 = local_7e0._0_4_ * 6.0;
              auVar203._0_4_ = fVar13 * (float)local_8c0._0_4_;
              auVar203._4_4_ = fVar13 * (float)local_8c0._4_4_;
              auVar203._8_4_ = fVar13 * fStack_8b8;
              auVar203._12_4_ = fVar13 * fStack_8b4;
              auVar178._4_4_ = fVar174;
              auVar178._0_4_ = fVar174;
              auVar178._8_4_ = fVar174;
              auVar178._12_4_ = fVar174;
              auVar66 = vfmadd132ps_fma(auVar178,auVar203,local_880._0_16_);
              fVar174 = auVar72._0_4_ * 6.0;
              auVar159._4_4_ = fVar174;
              auVar159._0_4_ = fVar174;
              auVar159._8_4_ = fVar174;
              auVar159._12_4_ = fVar174;
              auVar66 = vfmadd132ps_fma(auVar159,auVar66,local_8a0._0_16_);
              fVar174 = local_7c0._0_4_ * 6.0;
              auVar179._4_4_ = fVar174;
              auVar179._0_4_ = fVar174;
              auVar179._8_4_ = fVar174;
              auVar179._12_4_ = fVar174;
              auVar66 = vfmadd132ps_fma(auVar179,auVar66,local_860._0_16_);
              auVar160._0_4_ = auVar66._0_4_ * (float)local_800._0_4_;
              auVar160._4_4_ = auVar66._4_4_ * (float)local_800._0_4_;
              auVar160._8_4_ = auVar66._8_4_ * (float)local_800._0_4_;
              auVar160._12_4_ = auVar66._12_4_ * (float)local_800._0_4_;
              auVar66 = vdpps_avx(auVar63,auVar66,0x7f);
              fVar174 = auVar66._0_4_;
              auVar180._0_4_ = auVar63._0_4_ * fVar174;
              auVar180._4_4_ = auVar63._4_4_ * fVar174;
              auVar180._8_4_ = auVar63._8_4_ * fVar174;
              auVar180._12_4_ = auVar63._12_4_ * fVar174;
              auVar66 = vsubps_avx(auVar160,auVar180);
              fVar174 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar72 = vmaxss_avx(ZEXT416((uint)fVar156),
                                   ZEXT416((uint)(local_740._0_4_ * fVar168 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(auVar63,auVar19);
              auVar181._0_4_ = fVar170 * auVar66._0_4_ * fVar174;
              auVar181._4_4_ = fVar200 * auVar66._4_4_ * fVar174;
              auVar181._8_4_ = fVar173 * auVar66._8_4_ * fVar174;
              auVar181._12_4_ = fVar239 * auVar66._12_4_ * fVar174;
              auVar66 = vdpps_avx(auVar70,auVar144,0x7f);
              auVar73 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar156),auVar72);
              auVar71 = vdpps_avx(auVar1,auVar181,0x7f);
              vfmadd213ss_avx512f(auVar64,ZEXT416((uint)(fVar156 / fVar171)),auVar73);
              fVar170 = auVar66._0_4_ + auVar71._0_4_;
              auVar66 = vdpps_avx(local_990,auVar144,0x7f);
              auVar71 = vdpps_avx(auVar1,auVar70,0x7f);
              auVar64 = vmulss_avx512f(auVar69,auVar67);
              auVar67 = vmulss_avx512f(auVar67,auVar67);
              auVar68 = vaddss_avx512f(auVar68,ZEXT416((uint)(auVar64._0_4_ * auVar67._0_4_)));
              auVar67 = vdpps_avx(auVar1,local_990,0x7f);
              auVar69 = vfnmadd231ss_avx512f(auVar71,local_9c0._0_16_,ZEXT416((uint)fVar170));
              auVar67 = vfnmadd231ss_avx512f(auVar67,local_9c0._0_16_,auVar66);
              auVar71 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar172 = fVar172 - auVar71._0_4_;
              auVar64 = vshufps_avx(auVar63,auVar63,0xff);
              auVar71 = vfmsub213ss_fma(auVar69,auVar68,auVar64);
              auVar231._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar231._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar231._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar67 = ZEXT416((uint)(auVar67._0_4_ * auVar68._0_4_));
              auVar68 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar71._0_4_)),
                                        ZEXT416((uint)fVar170),auVar67);
              auVar71 = vinsertps_avx(auVar231,auVar67,0x1c);
              auVar221._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
              auVar221._8_4_ = auVar66._8_4_ ^ 0x80000000;
              auVar221._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar67 = vinsertps_avx(ZEXT416((uint)fVar170),auVar221,0x10);
              auVar204._0_4_ = auVar68._0_4_;
              auVar204._4_4_ = auVar204._0_4_;
              auVar204._8_4_ = auVar204._0_4_;
              auVar204._12_4_ = auVar204._0_4_;
              auVar66 = vdivps_avx(auVar71,auVar204);
              auVar71 = vdivps_avx(auVar67,auVar204);
              auVar67 = vbroadcastss_avx512vl(local_9c0._0_16_);
              auVar205._0_4_ = auVar67._0_4_ * auVar66._0_4_ + fVar172 * auVar71._0_4_;
              auVar205._4_4_ = auVar67._4_4_ * auVar66._4_4_ + fVar172 * auVar71._4_4_;
              auVar205._8_4_ = auVar67._8_4_ * auVar66._8_4_ + fVar172 * auVar71._8_4_;
              auVar205._12_4_ = auVar67._12_4_ * auVar66._12_4_ + fVar172 * auVar71._12_4_;
              auVar66 = vsubps_avx(local_740._0_16_,auVar205);
              auVar219 = ZEXT1664(auVar66);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar71 = vandps_avx512vl(local_9c0._0_16_,auVar20);
              auVar71 = vucomiss_avx512f(auVar71);
              if (!(bool)uVar57 && !(bool)uVar59) {
                auVar71 = vaddss_avx512f(auVar72,auVar71);
                auVar71 = vfmadd231ss_fma(auVar71,local_940,ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar67 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar21);
                if (auVar67._0_4_ < auVar71._0_4_) {
                  fVar168 = auVar66._0_4_ + (float)local_950._0_4_;
                  auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar168 < fVar201) {
                    bVar47 = 0;
                    goto LAB_01d54d84;
                  }
                  fVar170 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar168 <= fVar170) {
                    auVar66 = vmovshdup_avx(auVar66);
                    bVar47 = 0;
                    if ((auVar66._0_4_ < 0.0) || (1.0 < auVar66._0_4_)) goto LAB_01d54d84;
                    auVar206._0_12_ = ZEXT812(0);
                    auVar206._12_4_ = 0;
                    auVar182._4_8_ = auVar206._4_8_;
                    auVar182._0_4_ = fVar169;
                    auVar182._12_4_ = 0;
                    auVar66 = vrsqrt14ss_avx512f(auVar206,auVar182);
                    fVar172 = auVar66._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar56].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar47 = 0;
                      goto LAB_01d54d84;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar47 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01d54d84;
                    fVar169 = fVar172 * 1.5 + fVar169 * -0.5 * fVar172 * fVar172 * fVar172;
                    auVar183._0_4_ = auVar1._0_4_ * fVar169;
                    auVar183._4_4_ = auVar1._4_4_ * fVar169;
                    auVar183._8_4_ = auVar1._8_4_ * fVar169;
                    auVar183._12_4_ = auVar1._12_4_ * fVar169;
                    auVar71 = vfmadd213ps_fma(auVar64,auVar183,auVar63);
                    auVar66 = vshufps_avx(auVar183,auVar183,0xc9);
                    auVar1 = vshufps_avx(auVar63,auVar63,0xc9);
                    auVar184._0_4_ = auVar183._0_4_ * auVar1._0_4_;
                    auVar184._4_4_ = auVar183._4_4_ * auVar1._4_4_;
                    auVar184._8_4_ = auVar183._8_4_ * auVar1._8_4_;
                    auVar184._12_4_ = auVar183._12_4_ * auVar1._12_4_;
                    auVar63 = vfmsub231ps_fma(auVar184,auVar63,auVar66);
                    auVar66 = vshufps_avx(auVar63,auVar63,0xc9);
                    auVar1 = vshufps_avx(auVar71,auVar71,0xc9);
                    auVar63 = vshufps_avx(auVar63,auVar63,0xd2);
                    auVar146._0_4_ = auVar71._0_4_ * auVar63._0_4_;
                    auVar146._4_4_ = auVar71._4_4_ * auVar63._4_4_;
                    auVar146._8_4_ = auVar71._8_4_ * auVar63._8_4_;
                    auVar146._12_4_ = auVar71._12_4_ * auVar63._12_4_;
                    auVar66 = vfmsub231ps_fma(auVar146,auVar66,auVar1);
                    auVar132 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar132,auVar219);
                    auVar219 = vpermps_avx512f(auVar132,ZEXT1664(auVar66));
                    auVar132 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar132,ZEXT1664(auVar66));
                    local_380 = vbroadcastss_avx512f(auVar66);
                    local_400[0] = (RTCHitN)auVar219[0];
                    local_400[1] = (RTCHitN)auVar219[1];
                    local_400[2] = (RTCHitN)auVar219[2];
                    local_400[3] = (RTCHitN)auVar219[3];
                    local_400[4] = (RTCHitN)auVar219[4];
                    local_400[5] = (RTCHitN)auVar219[5];
                    local_400[6] = (RTCHitN)auVar219[6];
                    local_400[7] = (RTCHitN)auVar219[7];
                    local_400[8] = (RTCHitN)auVar219[8];
                    local_400[9] = (RTCHitN)auVar219[9];
                    local_400[10] = (RTCHitN)auVar219[10];
                    local_400[0xb] = (RTCHitN)auVar219[0xb];
                    local_400[0xc] = (RTCHitN)auVar219[0xc];
                    local_400[0xd] = (RTCHitN)auVar219[0xd];
                    local_400[0xe] = (RTCHitN)auVar219[0xe];
                    local_400[0xf] = (RTCHitN)auVar219[0xf];
                    local_400[0x10] = (RTCHitN)auVar219[0x10];
                    local_400[0x11] = (RTCHitN)auVar219[0x11];
                    local_400[0x12] = (RTCHitN)auVar219[0x12];
                    local_400[0x13] = (RTCHitN)auVar219[0x13];
                    local_400[0x14] = (RTCHitN)auVar219[0x14];
                    local_400[0x15] = (RTCHitN)auVar219[0x15];
                    local_400[0x16] = (RTCHitN)auVar219[0x16];
                    local_400[0x17] = (RTCHitN)auVar219[0x17];
                    local_400[0x18] = (RTCHitN)auVar219[0x18];
                    local_400[0x19] = (RTCHitN)auVar219[0x19];
                    local_400[0x1a] = (RTCHitN)auVar219[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar219[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar219[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar219[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar219[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar219[0x1f];
                    local_400[0x20] = (RTCHitN)auVar219[0x20];
                    local_400[0x21] = (RTCHitN)auVar219[0x21];
                    local_400[0x22] = (RTCHitN)auVar219[0x22];
                    local_400[0x23] = (RTCHitN)auVar219[0x23];
                    local_400[0x24] = (RTCHitN)auVar219[0x24];
                    local_400[0x25] = (RTCHitN)auVar219[0x25];
                    local_400[0x26] = (RTCHitN)auVar219[0x26];
                    local_400[0x27] = (RTCHitN)auVar219[0x27];
                    local_400[0x28] = (RTCHitN)auVar219[0x28];
                    local_400[0x29] = (RTCHitN)auVar219[0x29];
                    local_400[0x2a] = (RTCHitN)auVar219[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar219[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar219[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar219[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar219[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar219[0x2f];
                    local_400[0x30] = (RTCHitN)auVar219[0x30];
                    local_400[0x31] = (RTCHitN)auVar219[0x31];
                    local_400[0x32] = (RTCHitN)auVar219[0x32];
                    local_400[0x33] = (RTCHitN)auVar219[0x33];
                    local_400[0x34] = (RTCHitN)auVar219[0x34];
                    local_400[0x35] = (RTCHitN)auVar219[0x35];
                    local_400[0x36] = (RTCHitN)auVar219[0x36];
                    local_400[0x37] = (RTCHitN)auVar219[0x37];
                    local_400[0x38] = (RTCHitN)auVar219[0x38];
                    local_400[0x39] = (RTCHitN)auVar219[0x39];
                    local_400[0x3a] = (RTCHitN)auVar219[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar219[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar219[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar219[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar219[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar219[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar219 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar219);
                    vpcmpeqd_avx2(auVar219._0_32_,auVar219._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar168;
                    auVar219 = vmovdqa64_avx512f(local_500);
                    local_700 = vmovdqa64_avx512f(auVar219);
                    local_9f0.valid = (int *)local_700;
                    local_9f0.geometryUserPtr = pGVar3->userPtr;
                    local_9f0.context = context->user;
                    local_9f0.hit = local_400;
                    local_9f0.N = 0x10;
                    local_9f0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_9f0);
                      auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar219 = vmovdqa64_avx512f(local_700);
                    }
                    uVar14 = vptestmd_avx512f(auVar219,auVar219);
                    if ((short)uVar14 != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_9f0);
                        auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar219 = vmovdqa64_avx512f(local_700);
                      }
                      uVar60 = vptestmd_avx512f(auVar219,auVar219);
                      auVar132 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar5 = (bool)((byte)uVar60 & 1);
                      auVar219._0_4_ =
                           (uint)bVar5 * auVar132._0_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x200);
                      bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
                      auVar219._4_4_ =
                           (uint)bVar5 * auVar132._4_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x204);
                      bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
                      auVar219._8_4_ =
                           (uint)bVar5 * auVar132._8_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x208);
                      bVar5 = (bool)((byte)(uVar60 >> 3) & 1);
                      auVar219._12_4_ =
                           (uint)bVar5 * auVar132._12_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x20c);
                      bVar5 = (bool)((byte)(uVar60 >> 4) & 1);
                      auVar219._16_4_ =
                           (uint)bVar5 * auVar132._16_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x210);
                      bVar5 = (bool)((byte)(uVar60 >> 5) & 1);
                      auVar219._20_4_ =
                           (uint)bVar5 * auVar132._20_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x214);
                      bVar5 = (bool)((byte)(uVar60 >> 6) & 1);
                      auVar219._24_4_ =
                           (uint)bVar5 * auVar132._24_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x218);
                      bVar5 = (bool)((byte)(uVar60 >> 7) & 1);
                      auVar219._28_4_ =
                           (uint)bVar5 * auVar132._28_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x21c);
                      bVar5 = (bool)((byte)(uVar60 >> 8) & 1);
                      auVar219._32_4_ =
                           (uint)bVar5 * auVar132._32_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x220);
                      bVar5 = (bool)((byte)(uVar60 >> 9) & 1);
                      auVar219._36_4_ =
                           (uint)bVar5 * auVar132._36_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x224);
                      bVar5 = (bool)((byte)(uVar60 >> 10) & 1);
                      auVar219._40_4_ =
                           (uint)bVar5 * auVar132._40_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x228);
                      bVar5 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      auVar219._44_4_ =
                           (uint)bVar5 * auVar132._44_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x22c);
                      bVar5 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      auVar219._48_4_ =
                           (uint)bVar5 * auVar132._48_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x230);
                      bVar5 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      auVar219._52_4_ =
                           (uint)bVar5 * auVar132._52_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x234);
                      bVar5 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      auVar219._56_4_ =
                           (uint)bVar5 * auVar132._56_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x238);
                      bVar5 = SUB81(uVar60 >> 0xf,0);
                      auVar219._60_4_ =
                           (uint)bVar5 * auVar132._60_4_ |
                           (uint)!bVar5 * *(int *)(local_9f0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar219;
                      bVar47 = 1;
                      if ((short)uVar60 != 0) goto LAB_01d54d84;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar170;
                  }
                  bVar47 = 0;
                  goto LAB_01d54d84;
                }
              }
              bVar58 = uVar60 < 4;
              uVar60 = uVar60 + 1;
            } while (uVar60 != 5);
            bVar58 = false;
            auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar47 = 5;
LAB_01d54d84:
            bVar54 = (bool)(bVar54 | bVar58 & bVar47);
            uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar153._4_4_ = uVar142;
            auVar153._0_4_ = uVar142;
            auVar153._8_4_ = uVar142;
            auVar153._12_4_ = uVar142;
            auVar153._16_4_ = uVar142;
            auVar153._20_4_ = uVar142;
            auVar153._24_4_ = uVar142;
            auVar153._28_4_ = uVar142;
            auVar42._4_4_ = fStack_69c;
            auVar42._0_4_ = local_6a0;
            auVar42._8_4_ = fStack_698;
            auVar42._12_4_ = fStack_694;
            auVar42._16_4_ = fStack_690;
            auVar42._20_4_ = fStack_68c;
            auVar42._24_4_ = fStack_688;
            auVar42._28_4_ = fStack_684;
            uVar14 = vcmpps_avx512vl(auVar153,auVar42,0xd);
            bVar55 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar55 & (byte)uVar14;
            auVar77 = local_620;
          } while (bVar55 != 0);
        }
        auVar91 = local_660;
        bVar52 = local_6c0[0] | ~bVar52;
        auVar166._0_4_ = fVar141 + auVar77._0_4_;
        auVar166._4_4_ = fVar141 + auVar77._4_4_;
        auVar166._8_4_ = fVar141 + auVar77._8_4_;
        auVar166._12_4_ = fVar141 + auVar77._12_4_;
        auVar166._16_4_ = fVar141 + auVar77._16_4_;
        auVar166._20_4_ = fVar141 + auVar77._20_4_;
        auVar166._24_4_ = fVar141 + auVar77._24_4_;
        auVar166._28_4_ = fVar141 + auVar77._28_4_;
        uVar14 = vcmpps_avx512vl(auVar166,auVar153,2);
        bVar45 = (byte)uVar15 & bVar45 & (byte)uVar14;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar167,auVar30);
        auVar129._0_4_ = (uint)(bVar52 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar52 & 1) * 2;
        bVar58 = (bool)(bVar52 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * 2;
        auVar129._28_4_ = (uint)(bVar52 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar52 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_680,auVar129,5);
        bVar52 = (byte)uVar14 & bVar45;
        if (bVar52 != 0) {
          auVar1 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar66 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar63 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar71 = vminps_avx(auVar1,auVar63);
          auVar1 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar63 = vmaxps_avx(auVar66,auVar1);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar71,auVar185);
          auVar1 = vandps_avx(auVar63,auVar185);
          auVar66 = vmaxps_avx(auVar66,auVar1);
          auVar1 = vmovshdup_avx(auVar66);
          auVar1 = vmaxss_avx(auVar1,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar1);
          fVar156 = auVar66._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar63,auVar63,0xff);
          local_6a0 = fVar141 + local_660._0_4_;
          fStack_69c = fVar141 + local_660._4_4_;
          fStack_698 = fVar141 + local_660._8_4_;
          fStack_694 = fVar141 + local_660._12_4_;
          fStack_690 = fVar141 + local_660._16_4_;
          fStack_68c = fVar141 + local_660._20_4_;
          fStack_688 = fVar141 + local_660._24_4_;
          fStack_684 = fVar141 + local_660._28_4_;
          local_6c0 = auVar129;
          do {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar77 = vblendmps_avx512vl(auVar154,auVar91);
            auVar130._0_4_ =
                 (uint)(bVar52 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 0x7f800000;
            auVar130._24_4_ =
                 (uint)(bVar52 >> 6) * auVar77._24_4_ | (uint)!(bool)(bVar52 >> 6) * 0x7f800000;
            auVar130._28_4_ = 0x7f800000;
            auVar77 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar77 = vminps_avx(auVar130,auVar77);
            auVar92 = vshufpd_avx(auVar77,auVar77,5);
            auVar77 = vminps_avx(auVar77,auVar92);
            auVar92 = vpermpd_avx2(auVar77,0x4e);
            auVar77 = vminps_avx(auVar77,auVar92);
            uVar14 = vcmpps_avx512vl(auVar130,auVar77,0);
            bVar47 = (byte)uVar14 & bVar52;
            bVar55 = bVar52;
            if (bVar47 != 0) {
              bVar55 = bVar47;
            }
            iVar17 = 0;
            for (uVar62 = (uint)bVar55; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar62 = *(uint *)(local_540 + (uint)(iVar17 << 2));
            uVar61 = *(uint *)(local_640 + (uint)(iVar17 << 2));
            fVar168 = auVar65._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              fVar168 = sqrtf((float)local_9a0._0_4_);
            }
            auVar66 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar62),0x10);
            auVar219 = ZEXT1664(auVar66);
            bVar58 = true;
            uVar60 = 0;
            do {
              uVar142 = auVar219._0_4_;
              auVar147._4_4_ = uVar142;
              auVar147._0_4_ = uVar142;
              auVar147._8_4_ = uVar142;
              auVar147._12_4_ = uVar142;
              auVar1 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_990);
              auVar63 = auVar219._0_16_;
              auVar66 = vmovshdup_avx(auVar63);
              local_7e0._0_16_ = auVar66;
              fVar200 = 1.0 - auVar66._0_4_;
              auVar66 = vshufps_avx(auVar63,auVar63,0x55);
              fVar169 = auVar66._0_4_;
              auVar186._0_4_ = local_8a0._0_4_ * fVar169;
              fVar170 = auVar66._4_4_;
              auVar186._4_4_ = local_8a0._4_4_ * fVar170;
              fVar172 = auVar66._8_4_;
              auVar186._8_4_ = local_8a0._8_4_ * fVar172;
              fVar171 = auVar66._12_4_;
              auVar186._12_4_ = local_8a0._12_4_ * fVar171;
              _local_7c0 = ZEXT416((uint)fVar200);
              auVar207._4_4_ = fVar200;
              auVar207._0_4_ = fVar200;
              auVar207._8_4_ = fVar200;
              auVar207._12_4_ = fVar200;
              auVar66 = vfmadd231ps_fma(auVar186,auVar207,local_860._0_16_);
              auVar215._0_4_ = local_880._0_4_ * fVar169;
              auVar215._4_4_ = local_880._4_4_ * fVar170;
              auVar215._8_4_ = local_880._8_4_ * fVar172;
              auVar215._12_4_ = local_880._12_4_ * fVar171;
              auVar63 = vfmadd231ps_fma(auVar215,auVar207,local_8a0._0_16_);
              auVar222._0_4_ = fVar169 * (float)local_8c0._0_4_;
              auVar222._4_4_ = fVar170 * (float)local_8c0._4_4_;
              auVar222._8_4_ = fVar172 * fStack_8b8;
              auVar222._12_4_ = fVar171 * fStack_8b4;
              auVar71 = vfmadd231ps_fma(auVar222,auVar207,local_880._0_16_);
              auVar228._0_4_ = fVar169 * auVar63._0_4_;
              auVar228._4_4_ = fVar170 * auVar63._4_4_;
              auVar228._8_4_ = fVar172 * auVar63._8_4_;
              auVar228._12_4_ = fVar171 * auVar63._12_4_;
              auVar66 = vfmadd231ps_fma(auVar228,auVar207,auVar66);
              auVar187._0_4_ = fVar169 * auVar71._0_4_;
              auVar187._4_4_ = fVar170 * auVar71._4_4_;
              auVar187._8_4_ = fVar172 * auVar71._8_4_;
              auVar187._12_4_ = fVar171 * auVar71._12_4_;
              auVar63 = vfmadd231ps_fma(auVar187,auVar207,auVar63);
              auVar216._0_4_ = fVar169 * auVar63._0_4_;
              auVar216._4_4_ = fVar170 * auVar63._4_4_;
              auVar216._8_4_ = fVar172 * auVar63._8_4_;
              auVar216._12_4_ = fVar171 * auVar63._12_4_;
              auVar71 = vfmadd231ps_fma(auVar216,auVar66,auVar207);
              auVar66 = vsubps_avx(auVar63,auVar66);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar63 = vmulps_avx512vl(auVar66,auVar22);
              local_7a0._0_16_ = auVar71;
              auVar1 = vsubps_avx(auVar1,auVar71);
              auVar66 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar169 = auVar66._0_4_;
              local_740 = auVar219;
              if (fVar169 < 0.0) {
                auVar132._0_4_ = sqrtf(fVar169);
                auVar132._4_60_ = extraout_var_00;
                auVar71 = auVar132._0_16_;
              }
              else {
                auVar71 = vsqrtss_avx(auVar66,auVar66);
              }
              local_800._0_16_ = vdpps_avx(auVar63,auVar63,0x7f);
              fVar170 = local_800._0_4_;
              auVar188._4_12_ = ZEXT812(0) << 0x20;
              auVar188._0_4_ = fVar170;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              fVar172 = local_9c0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar64 = vxorps_avx512vl(local_800._0_16_,auVar23);
              auVar67 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar67._0_4_;
              local_980._0_4_ = auVar71._0_4_;
              if (fVar170 < auVar64._0_4_) {
                fVar171 = sqrtf(fVar170);
                auVar71 = ZEXT416((uint)local_980._0_4_);
              }
              else {
                auVar67 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar171 = auVar67._0_4_;
              }
              fVar200 = local_9c0._0_4_;
              auVar64 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar172 * 1.5 +
                                                 fVar170 * -0.5 * fVar200 * fVar200 * fVar200)));
              auVar67 = vmulps_avx512vl(auVar63,auVar64);
              local_9c0._0_16_ = vdpps_avx(auVar1,auVar67,0x7f);
              auVar69 = vaddss_avx512f(auVar71,ZEXT416(0x3f800000));
              auVar148._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
              auVar148._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
              auVar148._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
              auVar148._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
              auVar66 = vsubps_avx(auVar66,auVar148);
              fVar170 = auVar66._0_4_;
              auVar161._4_12_ = ZEXT812(0) << 0x20;
              auVar161._0_4_ = fVar170;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
              auVar72 = vmulss_avx512f(auVar68,ZEXT416(0x3fc00000));
              auVar73 = vmulss_avx512f(auVar66,ZEXT416(0xbf000000));
              uVar59 = fVar170 == 0.0;
              uVar57 = fVar170 < 0.0;
              if ((bool)uVar57) {
                local_910._0_4_ = auVar72._0_4_;
                _local_930 = auVar64;
                local_920 = auVar67;
                local_900 = auVar68;
                fVar170 = sqrtf(fVar170);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar72 = ZEXT416((uint)local_910._0_4_);
                auVar71 = ZEXT416((uint)local_980._0_4_);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar67 = local_920;
                auVar68 = local_900;
                auVar64 = _local_930;
              }
              else {
                auVar66 = vsqrtss_avx(auVar66,auVar66);
                fVar170 = auVar66._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar64);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar66 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar172 = auVar66._0_4_ * 6.0;
              fVar200 = local_7e0._0_4_ * 6.0;
              auVar208._0_4_ = fVar200 * (float)local_8c0._0_4_;
              auVar208._4_4_ = fVar200 * (float)local_8c0._4_4_;
              auVar208._8_4_ = fVar200 * fStack_8b8;
              auVar208._12_4_ = fVar200 * fStack_8b4;
              auVar189._4_4_ = fVar172;
              auVar189._0_4_ = fVar172;
              auVar189._8_4_ = fVar172;
              auVar189._12_4_ = fVar172;
              auVar66 = vfmadd132ps_fma(auVar189,auVar208,local_880._0_16_);
              fVar172 = auVar70._0_4_ * 6.0;
              auVar162._4_4_ = fVar172;
              auVar162._0_4_ = fVar172;
              auVar162._8_4_ = fVar172;
              auVar162._12_4_ = fVar172;
              auVar66 = vfmadd132ps_fma(auVar162,auVar66,local_8a0._0_16_);
              fVar172 = local_7c0._0_4_ * 6.0;
              auVar190._4_4_ = fVar172;
              auVar190._0_4_ = fVar172;
              auVar190._8_4_ = fVar172;
              auVar190._12_4_ = fVar172;
              auVar66 = vfmadd132ps_fma(auVar190,auVar66,local_860._0_16_);
              auVar163._0_4_ = auVar66._0_4_ * (float)local_800._0_4_;
              auVar163._4_4_ = auVar66._4_4_ * (float)local_800._0_4_;
              auVar163._8_4_ = auVar66._8_4_ * (float)local_800._0_4_;
              auVar163._12_4_ = auVar66._12_4_ * (float)local_800._0_4_;
              auVar66 = vdpps_avx(auVar63,auVar66,0x7f);
              fVar172 = auVar66._0_4_;
              auVar191._0_4_ = auVar63._0_4_ * fVar172;
              auVar191._4_4_ = auVar63._4_4_ * fVar172;
              auVar191._8_4_ = auVar63._8_4_ * fVar172;
              auVar191._12_4_ = auVar63._12_4_ * fVar172;
              auVar66 = vsubps_avx(auVar163,auVar191);
              fVar172 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar156),
                                   ZEXT416((uint)(local_740._0_4_ * fVar168 * 1.9073486e-06)));
              auVar192._0_4_ = auVar66._0_4_ * fVar172;
              auVar192._4_4_ = auVar66._4_4_ * fVar172;
              auVar192._8_4_ = auVar66._8_4_ * fVar172;
              auVar192._12_4_ = auVar66._12_4_ * fVar172;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(auVar63,auVar24);
              auVar75 = vmulps_avx512vl(auVar64,auVar192);
              auVar66 = vdpps_avx(auVar74,auVar67,0x7f);
              auVar64 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar156),auVar70);
              auVar71 = vdpps_avx(auVar1,auVar75,0x7f);
              vfmadd213ss_avx512f(auVar69,ZEXT416((uint)(fVar156 / fVar171)),auVar64);
              fVar172 = auVar66._0_4_ + auVar71._0_4_;
              auVar66 = vdpps_avx(local_990,auVar67,0x7f);
              auVar71 = vdpps_avx(auVar1,auVar74,0x7f);
              auVar67 = vmulss_avx512f(auVar73,auVar68);
              auVar64 = vmulss_avx512f(auVar68,auVar68);
              auVar68 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar67._0_4_ * auVar64._0_4_)));
              auVar67 = vdpps_avx(auVar1,local_990,0x7f);
              auVar69 = vfnmadd231ss_avx512f(auVar71,local_9c0._0_16_,ZEXT416((uint)fVar172));
              auVar67 = vfnmadd231ss_avx512f(auVar67,local_9c0._0_16_,auVar66);
              auVar71 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar170 = fVar170 - auVar71._0_4_;
              auVar64 = vshufps_avx(auVar63,auVar63,0xff);
              auVar71 = vfmsub213ss_fma(auVar69,auVar68,auVar64);
              auVar232._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar67 = ZEXT416((uint)(auVar67._0_4_ * auVar68._0_4_));
              auVar68 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar71._0_4_)),
                                        ZEXT416((uint)fVar172),auVar67);
              auVar71 = vinsertps_avx(auVar232,auVar67,0x1c);
              auVar223._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
              auVar223._8_4_ = auVar66._8_4_ ^ 0x80000000;
              auVar223._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar67 = vinsertps_avx(ZEXT416((uint)fVar172),auVar223,0x10);
              auVar209._0_4_ = auVar68._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar66 = vdivps_avx(auVar71,auVar209);
              auVar71 = vdivps_avx(auVar67,auVar209);
              auVar67 = vbroadcastss_avx512vl(local_9c0._0_16_);
              auVar210._0_4_ = auVar67._0_4_ * auVar66._0_4_ + fVar170 * auVar71._0_4_;
              auVar210._4_4_ = auVar67._4_4_ * auVar66._4_4_ + fVar170 * auVar71._4_4_;
              auVar210._8_4_ = auVar67._8_4_ * auVar66._8_4_ + fVar170 * auVar71._8_4_;
              auVar210._12_4_ = auVar67._12_4_ * auVar66._12_4_ + fVar170 * auVar71._12_4_;
              auVar66 = vsubps_avx(local_740._0_16_,auVar210);
              auVar219 = ZEXT1664(auVar66);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar71 = vandps_avx512vl(local_9c0._0_16_,auVar25);
              auVar71 = vucomiss_avx512f(auVar71);
              if (!(bool)uVar57 && !(bool)uVar59) {
                auVar71 = vaddss_avx512f(auVar70,auVar71);
                auVar71 = vfmadd231ss_fma(auVar71,local_940,ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar67 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar26);
                if (auVar67._0_4_ < auVar71._0_4_) {
                  fVar168 = auVar66._0_4_ + (float)local_950._0_4_;
                  auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar168 < fVar201) {
                    bVar55 = 0;
                    goto LAB_01d559f0;
                  }
                  fVar170 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar170 < fVar168) {
                    bVar55 = 0;
                    goto LAB_01d559f0;
                  }
                  auVar66 = vmovshdup_avx(auVar66);
                  bVar55 = 0;
                  if ((auVar66._0_4_ < 0.0) || (1.0 < auVar66._0_4_)) goto LAB_01d559f0;
                  auVar211._0_12_ = ZEXT812(0);
                  auVar211._12_4_ = 0;
                  auVar193._4_8_ = auVar211._4_8_;
                  auVar193._0_4_ = fVar169;
                  auVar193._12_4_ = 0;
                  auVar66 = vrsqrt14ss_avx512f(auVar211,auVar193);
                  fVar172 = auVar66._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar56].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar55 = 0;
                    goto LAB_01d559f0;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar55 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01d559f0;
                  fVar169 = fVar172 * 1.5 + fVar169 * -0.5 * fVar172 * fVar172 * fVar172;
                  auVar194._0_4_ = auVar1._0_4_ * fVar169;
                  auVar194._4_4_ = auVar1._4_4_ * fVar169;
                  auVar194._8_4_ = auVar1._8_4_ * fVar169;
                  auVar194._12_4_ = auVar1._12_4_ * fVar169;
                  auVar71 = vfmadd213ps_fma(auVar64,auVar194,auVar63);
                  auVar66 = vshufps_avx(auVar194,auVar194,0xc9);
                  auVar1 = vshufps_avx(auVar63,auVar63,0xc9);
                  auVar195._0_4_ = auVar194._0_4_ * auVar1._0_4_;
                  auVar195._4_4_ = auVar194._4_4_ * auVar1._4_4_;
                  auVar195._8_4_ = auVar194._8_4_ * auVar1._8_4_;
                  auVar195._12_4_ = auVar194._12_4_ * auVar1._12_4_;
                  auVar63 = vfmsub231ps_fma(auVar195,auVar63,auVar66);
                  auVar66 = vshufps_avx(auVar63,auVar63,0xc9);
                  auVar1 = vshufps_avx(auVar71,auVar71,0xc9);
                  auVar63 = vshufps_avx(auVar63,auVar63,0xd2);
                  auVar149._0_4_ = auVar71._0_4_ * auVar63._0_4_;
                  auVar149._4_4_ = auVar71._4_4_ * auVar63._4_4_;
                  auVar149._8_4_ = auVar71._8_4_ * auVar63._8_4_;
                  auVar149._12_4_ = auVar71._12_4_ * auVar63._12_4_;
                  auVar66 = vfmsub231ps_fma(auVar149,auVar66,auVar1);
                  auVar132 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar132,auVar219);
                  auVar219 = vpermps_avx512f(auVar132,ZEXT1664(auVar66));
                  auVar132 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar132,ZEXT1664(auVar66));
                  local_380 = vbroadcastss_avx512f(auVar66);
                  local_400[0] = (RTCHitN)auVar219[0];
                  local_400[1] = (RTCHitN)auVar219[1];
                  local_400[2] = (RTCHitN)auVar219[2];
                  local_400[3] = (RTCHitN)auVar219[3];
                  local_400[4] = (RTCHitN)auVar219[4];
                  local_400[5] = (RTCHitN)auVar219[5];
                  local_400[6] = (RTCHitN)auVar219[6];
                  local_400[7] = (RTCHitN)auVar219[7];
                  local_400[8] = (RTCHitN)auVar219[8];
                  local_400[9] = (RTCHitN)auVar219[9];
                  local_400[10] = (RTCHitN)auVar219[10];
                  local_400[0xb] = (RTCHitN)auVar219[0xb];
                  local_400[0xc] = (RTCHitN)auVar219[0xc];
                  local_400[0xd] = (RTCHitN)auVar219[0xd];
                  local_400[0xe] = (RTCHitN)auVar219[0xe];
                  local_400[0xf] = (RTCHitN)auVar219[0xf];
                  local_400[0x10] = (RTCHitN)auVar219[0x10];
                  local_400[0x11] = (RTCHitN)auVar219[0x11];
                  local_400[0x12] = (RTCHitN)auVar219[0x12];
                  local_400[0x13] = (RTCHitN)auVar219[0x13];
                  local_400[0x14] = (RTCHitN)auVar219[0x14];
                  local_400[0x15] = (RTCHitN)auVar219[0x15];
                  local_400[0x16] = (RTCHitN)auVar219[0x16];
                  local_400[0x17] = (RTCHitN)auVar219[0x17];
                  local_400[0x18] = (RTCHitN)auVar219[0x18];
                  local_400[0x19] = (RTCHitN)auVar219[0x19];
                  local_400[0x1a] = (RTCHitN)auVar219[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar219[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar219[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar219[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar219[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar219[0x1f];
                  local_400[0x20] = (RTCHitN)auVar219[0x20];
                  local_400[0x21] = (RTCHitN)auVar219[0x21];
                  local_400[0x22] = (RTCHitN)auVar219[0x22];
                  local_400[0x23] = (RTCHitN)auVar219[0x23];
                  local_400[0x24] = (RTCHitN)auVar219[0x24];
                  local_400[0x25] = (RTCHitN)auVar219[0x25];
                  local_400[0x26] = (RTCHitN)auVar219[0x26];
                  local_400[0x27] = (RTCHitN)auVar219[0x27];
                  local_400[0x28] = (RTCHitN)auVar219[0x28];
                  local_400[0x29] = (RTCHitN)auVar219[0x29];
                  local_400[0x2a] = (RTCHitN)auVar219[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar219[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar219[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar219[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar219[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar219[0x2f];
                  local_400[0x30] = (RTCHitN)auVar219[0x30];
                  local_400[0x31] = (RTCHitN)auVar219[0x31];
                  local_400[0x32] = (RTCHitN)auVar219[0x32];
                  local_400[0x33] = (RTCHitN)auVar219[0x33];
                  local_400[0x34] = (RTCHitN)auVar219[0x34];
                  local_400[0x35] = (RTCHitN)auVar219[0x35];
                  local_400[0x36] = (RTCHitN)auVar219[0x36];
                  local_400[0x37] = (RTCHitN)auVar219[0x37];
                  local_400[0x38] = (RTCHitN)auVar219[0x38];
                  local_400[0x39] = (RTCHitN)auVar219[0x39];
                  local_400[0x3a] = (RTCHitN)auVar219[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar219[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar219[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar219[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar219[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar219[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar219 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar219);
                  vpcmpeqd_avx2(auVar219._0_32_,auVar219._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar168;
                  auVar219 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar219);
                  local_9f0.valid = (int *)local_700;
                  local_9f0.geometryUserPtr = pGVar3->userPtr;
                  local_9f0.context = context->user;
                  local_9f0.hit = local_400;
                  local_9f0.N = 0x10;
                  local_9f0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_9f0);
                    auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    auVar219 = vmovdqa64_avx512f(local_700);
                  }
                  uVar14 = vptestmd_avx512f(auVar219,auVar219);
                  if ((short)uVar14 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_9f0);
                      auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar219 = vmovdqa64_avx512f(local_700);
                    }
                    uVar60 = vptestmd_avx512f(auVar219,auVar219);
                    auVar219 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar5 = (bool)((byte)uVar60 & 1);
                    auVar133._0_4_ =
                         (uint)bVar5 * auVar219._0_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x200);
                    bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
                    auVar133._4_4_ =
                         (uint)bVar5 * auVar219._4_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x204);
                    bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
                    auVar133._8_4_ =
                         (uint)bVar5 * auVar219._8_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x208);
                    bVar5 = (bool)((byte)(uVar60 >> 3) & 1);
                    auVar133._12_4_ =
                         (uint)bVar5 * auVar219._12_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x20c);
                    bVar5 = (bool)((byte)(uVar60 >> 4) & 1);
                    auVar133._16_4_ =
                         (uint)bVar5 * auVar219._16_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x210);
                    bVar5 = (bool)((byte)(uVar60 >> 5) & 1);
                    auVar133._20_4_ =
                         (uint)bVar5 * auVar219._20_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x214);
                    bVar5 = (bool)((byte)(uVar60 >> 6) & 1);
                    auVar133._24_4_ =
                         (uint)bVar5 * auVar219._24_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x218);
                    bVar5 = (bool)((byte)(uVar60 >> 7) & 1);
                    auVar133._28_4_ =
                         (uint)bVar5 * auVar219._28_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x21c);
                    bVar5 = (bool)((byte)(uVar60 >> 8) & 1);
                    auVar133._32_4_ =
                         (uint)bVar5 * auVar219._32_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x220);
                    bVar5 = (bool)((byte)(uVar60 >> 9) & 1);
                    auVar133._36_4_ =
                         (uint)bVar5 * auVar219._36_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x224);
                    bVar5 = (bool)((byte)(uVar60 >> 10) & 1);
                    auVar133._40_4_ =
                         (uint)bVar5 * auVar219._40_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x228);
                    bVar5 = (bool)((byte)(uVar60 >> 0xb) & 1);
                    auVar133._44_4_ =
                         (uint)bVar5 * auVar219._44_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x22c);
                    bVar5 = (bool)((byte)(uVar60 >> 0xc) & 1);
                    auVar133._48_4_ =
                         (uint)bVar5 * auVar219._48_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x230);
                    bVar5 = (bool)((byte)(uVar60 >> 0xd) & 1);
                    auVar133._52_4_ =
                         (uint)bVar5 * auVar219._52_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x234);
                    bVar5 = (bool)((byte)(uVar60 >> 0xe) & 1);
                    auVar133._56_4_ =
                         (uint)bVar5 * auVar219._56_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x238);
                    bVar5 = SUB81(uVar60 >> 0xf,0);
                    auVar133._60_4_ =
                         (uint)bVar5 * auVar219._60_4_ |
                         (uint)!bVar5 * *(int *)(local_9f0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar133;
                    bVar55 = 1;
                    if ((short)uVar60 != 0) goto LAB_01d559f0;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar170;
                  bVar55 = 0;
                  goto LAB_01d559f0;
                }
              }
              bVar58 = uVar60 < 4;
              uVar60 = uVar60 + 1;
            } while (uVar60 != 5);
            bVar58 = false;
            auVar155 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar55 = 5;
LAB_01d559f0:
            bVar54 = (bool)(bVar54 | bVar58 & bVar55);
            uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar153._4_4_ = uVar142;
            auVar153._0_4_ = uVar142;
            auVar153._8_4_ = uVar142;
            auVar153._12_4_ = uVar142;
            auVar153._16_4_ = uVar142;
            auVar153._20_4_ = uVar142;
            auVar153._24_4_ = uVar142;
            auVar153._28_4_ = uVar142;
            auVar43._4_4_ = fStack_69c;
            auVar43._0_4_ = local_6a0;
            auVar43._8_4_ = fStack_698;
            auVar43._12_4_ = fStack_694;
            auVar43._16_4_ = fStack_690;
            auVar43._20_4_ = fStack_68c;
            auVar43._24_4_ = fStack_688;
            auVar43._28_4_ = fStack_684;
            uVar14 = vcmpps_avx512vl(auVar153,auVar43,0xd);
            bVar52 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar52 & (byte)uVar14;
            auVar129 = local_6c0;
          } while (bVar52 != 0);
        }
        auVar219 = ZEXT3264(local_8e0);
        uVar15 = vpcmpgtd_avx512vl(auVar129,local_680);
        uVar16 = vpcmpd_avx512vl(local_680,local_600,1);
        auVar198._0_4_ = fVar141 + (float)local_440._0_4_;
        auVar198._4_4_ = fVar141 + (float)local_440._4_4_;
        auVar198._8_4_ = fVar141 + fStack_438;
        auVar198._12_4_ = fVar141 + fStack_434;
        auVar198._16_4_ = fVar141 + fStack_430;
        auVar198._20_4_ = fVar141 + fStack_42c;
        auVar198._24_4_ = fVar141 + fStack_428;
        auVar198._28_4_ = fVar141 + fStack_424;
        uVar14 = vcmpps_avx512vl(auVar198,auVar153,2);
        bVar48 = bVar48 & (byte)uVar16 & (byte)uVar14;
        auVar199._0_4_ = fVar141 + local_660._0_4_;
        auVar199._4_4_ = fVar141 + local_660._4_4_;
        auVar199._8_4_ = fVar141 + local_660._8_4_;
        auVar199._12_4_ = fVar141 + local_660._12_4_;
        auVar199._16_4_ = fVar141 + local_660._16_4_;
        auVar199._20_4_ = fVar141 + local_660._20_4_;
        auVar199._24_4_ = fVar141 + local_660._24_4_;
        auVar199._28_4_ = fVar141 + local_660._28_4_;
        uVar14 = vcmpps_avx512vl(auVar199,auVar153,2);
        bVar45 = bVar45 & (byte)uVar15 & (byte)uVar14 | bVar48;
        prim = local_8f0;
        if (bVar45 != 0) {
          uVar53 = (ulong)uVar51;
          abStack_1a0[uVar53 * 0x60] = bVar45;
          auVar131._0_4_ =
               (uint)(bVar48 & 1) * local_440._0_4_ |
               (uint)!(bool)(bVar48 & 1) * (int)local_660._0_4_;
          bVar58 = (bool)(bVar48 >> 1 & 1);
          auVar131._4_4_ = (uint)bVar58 * local_440._4_4_ | (uint)!bVar58 * (int)local_660._4_4_;
          bVar58 = (bool)(bVar48 >> 2 & 1);
          auVar131._8_4_ = (uint)bVar58 * (int)fStack_438 | (uint)!bVar58 * (int)local_660._8_4_;
          bVar58 = (bool)(bVar48 >> 3 & 1);
          auVar131._12_4_ = (uint)bVar58 * (int)fStack_434 | (uint)!bVar58 * (int)local_660._12_4_;
          bVar58 = (bool)(bVar48 >> 4 & 1);
          auVar131._16_4_ = (uint)bVar58 * (int)fStack_430 | (uint)!bVar58 * (int)local_660._16_4_;
          bVar58 = (bool)(bVar48 >> 5 & 1);
          auVar131._20_4_ = (uint)bVar58 * (int)fStack_42c | (uint)!bVar58 * (int)local_660._20_4_;
          auVar131._24_4_ =
               (uint)(bVar48 >> 6) * (int)fStack_428 |
               (uint)!(bool)(bVar48 >> 6) * (int)local_660._24_4_;
          auVar131._28_4_ = local_660._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar53 * 0x60) = auVar131;
          uVar60 = vmovlps_avx(local_960);
          (&uStack_160)[uVar53 * 0xc] = uVar60;
          aiStack_158[uVar53 * 0x18] = local_cd0 + 1;
          uVar51 = uVar51 + 1;
        }
      }
    }
    do {
      uVar62 = uVar51;
      uVar61 = uVar62 - 1;
      if (uVar62 == 0) {
        if (bVar54 != false) {
          return bVar54;
        }
        uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar142;
        auVar32._0_4_ = uVar142;
        auVar32._8_4_ = uVar142;
        auVar32._12_4_ = uVar142;
        auVar32._16_4_ = uVar142;
        auVar32._20_4_ = uVar142;
        auVar32._24_4_ = uVar142;
        auVar32._28_4_ = uVar142;
        uVar14 = vcmpps_avx512vl(local_5e0,auVar32,2);
        uVar56 = (uint)local_8e8 & (uint)uVar14;
        local_8e8 = (ulong)uVar56;
        if (uVar56 == 0) {
          return false;
        }
        goto LAB_01d53231;
      }
      uVar60 = (ulong)uVar61;
      lVar50 = uVar60 * 0x60;
      auVar77 = *(undefined1 (*) [32])(auStack_180 + lVar50);
      auVar164._0_4_ = fVar141 + auVar77._0_4_;
      auVar164._4_4_ = fVar141 + auVar77._4_4_;
      auVar164._8_4_ = fVar141 + auVar77._8_4_;
      auVar164._12_4_ = fVar141 + auVar77._12_4_;
      auVar164._16_4_ = fVar141 + auVar77._16_4_;
      auVar164._20_4_ = fVar141 + auVar77._20_4_;
      auVar164._24_4_ = fVar141 + auVar77._24_4_;
      auVar164._28_4_ = fVar141 + auVar77._28_4_;
      uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar31._4_4_ = uVar142;
      auVar31._0_4_ = uVar142;
      auVar31._8_4_ = uVar142;
      auVar31._12_4_ = uVar142;
      auVar31._16_4_ = uVar142;
      auVar31._20_4_ = uVar142;
      auVar31._24_4_ = uVar142;
      auVar31._28_4_ = uVar142;
      uVar14 = vcmpps_avx512vl(auVar164,auVar31,2);
      uVar134 = (uint)uVar14 & (uint)abStack_1a0[lVar50];
      uVar51 = uVar61;
    } while (uVar134 == 0);
    uVar53 = (&uStack_160)[uVar60 * 0xc];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar53;
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar197,auVar77);
    bVar45 = (byte)uVar134;
    auVar127._0_4_ =
         (uint)(bVar45 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar45 & 1) * (int)auVar77._0_4_;
    bVar58 = (bool)((byte)(uVar134 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar58 * auVar91._4_4_ | (uint)!bVar58 * (int)auVar77._4_4_;
    bVar58 = (bool)((byte)(uVar134 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar58 * auVar91._8_4_ | (uint)!bVar58 * (int)auVar77._8_4_;
    bVar58 = (bool)((byte)(uVar134 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar58 * auVar91._12_4_ | (uint)!bVar58 * (int)auVar77._12_4_;
    bVar58 = (bool)((byte)(uVar134 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar58 * auVar91._16_4_ | (uint)!bVar58 * (int)auVar77._16_4_;
    bVar58 = (bool)((byte)(uVar134 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar58 * auVar91._20_4_ | (uint)!bVar58 * (int)auVar77._20_4_;
    bVar58 = (bool)((byte)(uVar134 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar58 * auVar91._24_4_ | (uint)!bVar58 * (int)auVar77._24_4_;
    auVar127._28_4_ =
         (uVar134 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar134 >> 7,0) * (int)auVar77._28_4_;
    auVar77 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar77 = vminps_avx(auVar127,auVar77);
    auVar91 = vshufpd_avx(auVar77,auVar77,5);
    auVar77 = vminps_avx(auVar77,auVar91);
    auVar91 = vpermpd_avx2(auVar77,0x4e);
    auVar77 = vminps_avx(auVar77,auVar91);
    uVar14 = vcmpps_avx512vl(auVar127,auVar77,0);
    bVar52 = (byte)uVar14 & bVar45;
    if (bVar52 != 0) {
      uVar134 = (uint)bVar52;
    }
    uVar135 = 0;
    for (; (uVar134 & 1) == 0; uVar134 = uVar134 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_cd0 = aiStack_158[uVar60 * 0x18];
    bVar45 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar45;
    abStack_1a0[lVar50] = bVar45;
    uVar51 = uVar62;
    if (bVar45 == 0) {
      uVar51 = uVar61;
    }
    uVar142 = (undefined4)uVar53;
    auVar150._4_4_ = uVar142;
    auVar150._0_4_ = uVar142;
    auVar150._8_4_ = uVar142;
    auVar150._12_4_ = uVar142;
    auVar150._16_4_ = uVar142;
    auVar150._20_4_ = uVar142;
    auVar150._24_4_ = uVar142;
    auVar150._28_4_ = uVar142;
    auVar66 = vmovshdup_avx(auVar157);
    auVar66 = vsubps_avx(auVar66,auVar157);
    auVar165._0_4_ = auVar66._0_4_;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar66 = vfmadd132ps_fma(auVar165,auVar150,_DAT_01faff20);
    auVar77 = ZEXT1632(auVar66);
    local_400[0] = (RTCHitN)auVar77[0];
    local_400[1] = (RTCHitN)auVar77[1];
    local_400[2] = (RTCHitN)auVar77[2];
    local_400[3] = (RTCHitN)auVar77[3];
    local_400[4] = (RTCHitN)auVar77[4];
    local_400[5] = (RTCHitN)auVar77[5];
    local_400[6] = (RTCHitN)auVar77[6];
    local_400[7] = (RTCHitN)auVar77[7];
    local_400[8] = (RTCHitN)auVar77[8];
    local_400[9] = (RTCHitN)auVar77[9];
    local_400[10] = (RTCHitN)auVar77[10];
    local_400[0xb] = (RTCHitN)auVar77[0xb];
    local_400[0xc] = (RTCHitN)auVar77[0xc];
    local_400[0xd] = (RTCHitN)auVar77[0xd];
    local_400[0xe] = (RTCHitN)auVar77[0xe];
    local_400[0xf] = (RTCHitN)auVar77[0xf];
    local_400[0x10] = (RTCHitN)auVar77[0x10];
    local_400[0x11] = (RTCHitN)auVar77[0x11];
    local_400[0x12] = (RTCHitN)auVar77[0x12];
    local_400[0x13] = (RTCHitN)auVar77[0x13];
    local_400[0x14] = (RTCHitN)auVar77[0x14];
    local_400[0x15] = (RTCHitN)auVar77[0x15];
    local_400[0x16] = (RTCHitN)auVar77[0x16];
    local_400[0x17] = (RTCHitN)auVar77[0x17];
    local_400[0x18] = (RTCHitN)auVar77[0x18];
    local_400[0x19] = (RTCHitN)auVar77[0x19];
    local_400[0x1a] = (RTCHitN)auVar77[0x1a];
    local_400[0x1b] = (RTCHitN)auVar77[0x1b];
    local_400[0x1c] = (RTCHitN)auVar77[0x1c];
    local_400[0x1d] = (RTCHitN)auVar77[0x1d];
    local_400[0x1e] = (RTCHitN)auVar77[0x1e];
    local_400[0x1f] = (RTCHitN)auVar77[0x1f];
    local_960._8_8_ = 0;
    local_960._0_8_ = *(ulong *)(local_400 + (ulong)uVar135 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }